

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [32];
  bool bVar55;
  undefined1 auVar56 [12];
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  uint uVar76;
  int iVar77;
  uint uVar78;
  ulong uVar79;
  ulong uVar80;
  byte unaff_BL;
  long lVar81;
  uint uVar82;
  undefined4 uVar83;
  ulong uVar84;
  float fVar85;
  float fVar86;
  undefined8 uVar87;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar88 [16];
  float fVar117;
  float fVar119;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 extraout_var [60];
  undefined1 auVar116 [64];
  undefined1 extraout_var_00 [60];
  float fVar120;
  float fVar151;
  float fVar152;
  vint4 bi_1;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar141 [32];
  float fVar153;
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  vint4 ai_2;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar199;
  float fVar210;
  float fVar211;
  vint4 ai;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [28];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar205 [16];
  undefined1 auVar209 [32];
  vint4 bi;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar232 [32];
  float fVar234;
  undefined1 auVar233 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar244 [32];
  float fVar242;
  float fVar251;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar249;
  float fVar250;
  undefined1 auVar243 [16];
  undefined1 auVar247 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar248 [64];
  vint4 ai_1;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar257 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [16];
  undefined1 auVar265 [32];
  undefined1 auVar264 [16];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  float fVar271;
  float fVar272;
  undefined1 auVar268 [16];
  undefined1 auVar269 [32];
  float fVar273;
  undefined1 auVar270 [32];
  undefined1 auVar274 [16];
  float fVar278;
  undefined1 auVar275 [32];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar276 [64];
  undefined1 auVar277 [64];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar292;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar293;
  float fVar294;
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar298;
  float fVar299;
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  float fVar300;
  undefined1 auVar297 [32];
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_c69;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  ulong local_720;
  undefined1 auStack_718 [24];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [32];
  uint local_5a0;
  uint uStack_59c;
  uint uStack_598;
  uint uStack_594;
  uint uStack_590;
  uint uStack_58c;
  uint uStack_588;
  uint uStack_584;
  uint local_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  uint uStack_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  RTCHitN local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar288 [32];
  
  PVar1 = prim[1];
  uVar80 = (ulong)(byte)PVar1;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar85 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  auVar88._0_4_ = fVar85 * auVar5._0_4_;
  auVar88._4_4_ = fVar85 * auVar5._4_4_;
  auVar88._8_4_ = fVar85 * auVar5._8_4_;
  auVar88._12_4_ = fVar85 * auVar5._12_4_;
  auVar216._0_4_ = fVar85 * auVar6._0_4_;
  auVar216._4_4_ = fVar85 * auVar6._4_4_;
  auVar216._8_4_ = fVar85 * auVar6._8_4_;
  auVar216._12_4_ = fVar85 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar80 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar79 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + uVar80 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  uVar79 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar285._4_4_ = auVar216._0_4_;
  auVar285._0_4_ = auVar216._0_4_;
  auVar285._8_4_ = auVar216._0_4_;
  auVar285._12_4_ = auVar216._0_4_;
  auVar122 = vshufps_avx(auVar216,auVar216,0x55);
  auVar89 = vshufps_avx(auVar216,auVar216,0xaa);
  fVar85 = auVar89._0_4_;
  auVar274._0_4_ = fVar85 * auVar7._0_4_;
  fVar117 = auVar89._4_4_;
  auVar274._4_4_ = fVar117 * auVar7._4_4_;
  fVar118 = auVar89._8_4_;
  auVar274._8_4_ = fVar118 * auVar7._8_4_;
  fVar119 = auVar89._12_4_;
  auVar274._12_4_ = fVar119 * auVar7._12_4_;
  auVar268._0_4_ = auVar10._0_4_ * fVar85;
  auVar268._4_4_ = auVar10._4_4_ * fVar117;
  auVar268._8_4_ = auVar10._8_4_ * fVar118;
  auVar268._12_4_ = auVar10._12_4_ * fVar119;
  auVar255._0_4_ = auVar96._0_4_ * fVar85;
  auVar255._4_4_ = auVar96._4_4_ * fVar117;
  auVar255._8_4_ = auVar96._8_4_ * fVar118;
  auVar255._12_4_ = auVar96._12_4_ * fVar119;
  auVar89 = vfmadd231ps_fma(auVar274,auVar122,auVar6);
  auVar123 = vfmadd231ps_fma(auVar268,auVar122,auVar9);
  auVar122 = vfmadd231ps_fma(auVar255,auVar90,auVar122);
  auVar176 = vfmadd231ps_fma(auVar89,auVar285,auVar5);
  auVar123 = vfmadd231ps_fma(auVar123,auVar285,auVar8);
  auVar138 = vfmadd231ps_fma(auVar122,auVar91,auVar285);
  auVar286._4_4_ = auVar88._0_4_;
  auVar286._0_4_ = auVar88._0_4_;
  auVar286._8_4_ = auVar88._0_4_;
  auVar286._12_4_ = auVar88._0_4_;
  auVar122 = vshufps_avx(auVar88,auVar88,0x55);
  auVar89 = vshufps_avx(auVar88,auVar88,0xaa);
  fVar85 = auVar89._0_4_;
  auVar217._0_4_ = fVar85 * auVar7._0_4_;
  fVar117 = auVar89._4_4_;
  auVar217._4_4_ = fVar117 * auVar7._4_4_;
  fVar118 = auVar89._8_4_;
  auVar217._8_4_ = fVar118 * auVar7._8_4_;
  fVar119 = auVar89._12_4_;
  auVar217._12_4_ = fVar119 * auVar7._12_4_;
  auVar121._0_4_ = auVar10._0_4_ * fVar85;
  auVar121._4_4_ = auVar10._4_4_ * fVar117;
  auVar121._8_4_ = auVar10._8_4_ * fVar118;
  auVar121._12_4_ = auVar10._12_4_ * fVar119;
  auVar89._0_4_ = auVar96._0_4_ * fVar85;
  auVar89._4_4_ = auVar96._4_4_ * fVar117;
  auVar89._8_4_ = auVar96._8_4_ * fVar118;
  auVar89._12_4_ = auVar96._12_4_ * fVar119;
  auVar6 = vfmadd231ps_fma(auVar217,auVar122,auVar6);
  auVar7 = vfmadd231ps_fma(auVar121,auVar122,auVar9);
  auVar9 = vfmadd231ps_fma(auVar89,auVar122,auVar90);
  auVar10 = vfmadd231ps_fma(auVar6,auVar286,auVar5);
  auVar90 = vfmadd231ps_fma(auVar7,auVar286,auVar8);
  auVar96 = vfmadd231ps_fma(auVar9,auVar286,auVar91);
  local_9c0._8_4_ = 0x7fffffff;
  local_9c0._0_8_ = 0x7fffffff7fffffff;
  local_9c0._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar176,local_9c0);
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar200,1);
  auVar6 = vblendvps_avx(auVar176,auVar200,auVar5);
  auVar5 = vandps_avx(auVar123,local_9c0);
  auVar5 = vcmpps_avx(auVar5,auVar200,1);
  auVar7 = vblendvps_avx(auVar123,auVar200,auVar5);
  auVar5 = vandps_avx(auVar138,local_9c0);
  auVar5 = vcmpps_avx(auVar5,auVar200,1);
  auVar5 = vblendvps_avx(auVar138,auVar200,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar243._8_4_ = 0x3f800000;
  auVar243._0_8_ = &DAT_3f8000003f800000;
  auVar243._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar243);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar243);
  auVar9 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar7 = vfnmadd213ps_fma(auVar5,auVar6,auVar243);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar80 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar91 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar138._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar138._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar138._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar138._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar80 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar218._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar218._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar218._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar218._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar123._1_3_ = 0;
  auVar123[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar80 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar90);
  auVar256._0_4_ = auVar5._0_4_ * auVar9._0_4_;
  auVar256._4_4_ = auVar5._4_4_ * auVar9._4_4_;
  auVar256._8_4_ = auVar5._8_4_ * auVar9._8_4_;
  auVar256._12_4_ = auVar5._12_4_ * auVar9._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar90);
  auVar122._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar122._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar122._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar122._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar79 + uVar80 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar96);
  auVar176._0_4_ = auVar91._0_4_ * auVar5._0_4_;
  auVar176._4_4_ = auVar91._4_4_ * auVar5._4_4_;
  auVar176._8_4_ = auVar91._8_4_ * auVar5._8_4_;
  auVar176._12_4_ = auVar91._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar80 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar96);
  auVar90._0_4_ = auVar91._0_4_ * auVar5._0_4_;
  auVar90._4_4_ = auVar91._4_4_ * auVar5._4_4_;
  auVar90._8_4_ = auVar91._8_4_ * auVar5._8_4_;
  auVar90._12_4_ = auVar91._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar138,auVar218);
  auVar6 = vpminsd_avx(auVar256,auVar122);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar176,auVar90);
  uVar83 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar263._4_4_ = uVar83;
  auVar263._0_4_ = uVar83;
  auVar263._8_4_ = uVar83;
  auVar263._12_4_ = uVar83;
  auVar6 = vmaxps_avx(auVar6,auVar263);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_5d0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_5d0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_5d0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_5d0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar138,auVar218);
  auVar6 = vpmaxsd_avx(auVar256,auVar122);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar176,auVar90);
  uVar83 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar96._4_4_ = uVar83;
  auVar96._0_4_ = uVar83;
  auVar96._8_4_ = uVar83;
  auVar96._12_4_ = uVar83;
  auVar6 = vminps_avx(auVar6,auVar96);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar91._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar91._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar91._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar91._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar123[4] = PVar1;
  auVar123._5_3_ = 0;
  auVar123[8] = PVar1;
  auVar123._9_3_ = 0;
  auVar123[0xc] = PVar1;
  auVar123._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar123,_DAT_01ff0cf0);
  auVar5 = vcmpps_avx(local_5d0,auVar91,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar76 = vmovmskps_avx(auVar5);
  local_c69 = uVar76 != 0;
  if (uVar76 == 0) {
    return local_c69;
  }
  uVar76 = uVar76 & 0xff;
  auVar110._16_16_ = mm_lookupmask_ps._240_16_;
  auVar110._0_16_ = mm_lookupmask_ps._240_16_;
  local_2c0 = vblendps_avx(auVar110,ZEXT832(0) << 0x20,0x80);
  iVar77 = 1 << ((uint)k & 0x1f);
  auVar102._4_4_ = iVar77;
  auVar102._0_4_ = iVar77;
  auVar102._8_4_ = iVar77;
  auVar102._12_4_ = iVar77;
  auVar102._16_4_ = iVar77;
  auVar102._20_4_ = iVar77;
  auVar102._24_4_ = iVar77;
  auVar102._28_4_ = iVar77;
  auVar17 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar110 = vpand_avx2(auVar102,auVar17);
  local_5c0 = vpcmpeqd_avx2(auVar110,auVar17);
  local_820 = 0x7fffffff;
  uStack_81c = 0x7fffffff;
  uStack_818 = 0x7fffffff;
  uStack_814 = 0x7fffffff;
  uStack_810 = 0x7fffffff;
  uStack_80c = 0x7fffffff;
  uStack_808 = 0x7fffffff;
  uStack_804 = 0x7fffffff;
  local_890 = prim;
LAB_0169544d:
  lVar81 = 0;
  local_888 = (ulong)uVar76;
  for (uVar79 = local_888; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar81 = lVar81 + 1;
  }
  uVar76 = *(uint *)(local_890 + 2);
  local_5a0 = *(uint *)(local_890 + lVar81 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar76].ptr;
  lVar81 = *(long *)&pGVar2[1].time_range.upper;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           (ulong)local_5a0 *
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar5 = *(undefined1 (*) [16])(lVar81 + (long)pGVar2[1].intersectionFilterN * uVar79);
  auVar6 = *(undefined1 (*) [16])(lVar81 + (long)pGVar2[1].intersectionFilterN * (uVar79 + 1));
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar85 = *(float *)(ray + k * 4 + 0x80);
  auVar287._4_4_ = fVar85;
  auVar287._0_4_ = fVar85;
  auVar287._8_4_ = fVar85;
  auVar287._12_4_ = fVar85;
  auVar288._16_4_ = fVar85;
  auVar288._0_16_ = auVar287;
  auVar288._20_4_ = fVar85;
  auVar288._24_4_ = fVar85;
  auVar288._28_4_ = fVar85;
  uVar83 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar295._4_4_ = uVar83;
  auVar295._0_4_ = uVar83;
  auVar295._8_4_ = uVar83;
  auVar295._12_4_ = uVar83;
  fStack_a70 = (float)uVar83;
  _local_a80 = auVar295;
  fStack_a6c = (float)uVar83;
  fStack_a68 = (float)uVar83;
  register0x000015dc = uVar83;
  auVar7 = vunpcklps_avx(auVar287,auVar295);
  fVar117 = *(float *)(ray + k * 4 + 0xc0);
  auVar201._4_4_ = fVar117;
  auVar201._0_4_ = fVar117;
  auVar201._8_4_ = fVar117;
  auVar201._12_4_ = fVar117;
  local_aa0._16_4_ = fVar117;
  local_aa0._0_16_ = auVar201;
  local_aa0._20_4_ = fVar117;
  local_aa0._24_4_ = fVar117;
  local_aa0._28_4_ = fVar117;
  local_9b0 = vinsertps_avx(auVar7,auVar201,0x28);
  auVar219._8_4_ = 0xbeaaaaab;
  auVar219._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar219._12_4_ = 0xbeaaaaab;
  auVar91 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar2[2].intersectionFilterN +
                              uVar79 * (long)pGVar2[2].pointQueryFunc),auVar5,auVar219);
  auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar2[2].intersectionFilterN +
                             (long)pGVar2[2].pointQueryFunc * (uVar79 + 1)),auVar6,auVar219);
  auVar220._0_4_ = (auVar6._0_4_ + auVar5._0_4_ + auVar91._0_4_ + auVar10._0_4_) * 0.25;
  auVar220._4_4_ = (auVar6._4_4_ + auVar5._4_4_ + auVar91._4_4_ + auVar10._4_4_) * 0.25;
  auVar220._8_4_ = (auVar6._8_4_ + auVar5._8_4_ + auVar91._8_4_ + auVar10._8_4_) * 0.25;
  auVar220._12_4_ = (auVar6._12_4_ + auVar5._12_4_ + auVar91._12_4_ + auVar10._12_4_) * 0.25;
  auVar7 = vsubps_avx(auVar220,auVar8);
  auVar7 = vdpps_avx(auVar7,local_9b0,0x7f);
  local_9d0 = vdpps_avx(local_9b0,local_9b0,0x7f);
  auVar266 = ZEXT1664(local_9d0);
  auVar9 = vrcpss_avx(local_9d0,local_9d0);
  auVar90 = vfnmadd213ss_fma(auVar9,local_9d0,ZEXT416(0x40000000));
  local_320 = auVar7._0_4_ * auVar9._0_4_ * auVar90._0_4_;
  auVar235._4_4_ = local_320;
  auVar235._0_4_ = local_320;
  auVar235._8_4_ = local_320;
  auVar235._12_4_ = local_320;
  fStack_930 = local_320;
  _local_940 = auVar235;
  fStack_92c = local_320;
  fStack_928 = local_320;
  fStack_924 = local_320;
  auVar7 = vfmadd231ps_fma(auVar8,local_9b0,auVar235);
  auVar7 = vblendps_avx(auVar7,_DAT_01feba10,8);
  auVar9 = vsubps_avx(auVar5,auVar7);
  auVar276 = ZEXT1664(auVar9);
  auVar10 = vsubps_avx(auVar10,auVar7);
  auVar91 = vsubps_avx(auVar91,auVar7);
  auVar90 = vsubps_avx(auVar6,auVar7);
  auVar5 = vmovshdup_avx(auVar9);
  uVar87 = auVar5._0_8_;
  local_980._8_8_ = uVar87;
  local_980._0_8_ = uVar87;
  local_980._16_8_ = uVar87;
  local_980._24_8_ = uVar87;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar87 = auVar5._0_8_;
  local_640._8_8_ = uVar87;
  local_640._0_8_ = uVar87;
  local_640._16_8_ = uVar87;
  local_640._24_8_ = uVar87;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_1a0 = auVar5._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar5 = vmovshdup_avx(auVar91);
  local_1c0 = auVar5._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar6 = vshufps_avx(auVar91,auVar91,0xaa);
  uVar87 = auVar6._0_8_;
  auVar282._8_8_ = uVar87;
  auVar282._0_8_ = uVar87;
  auVar282._16_8_ = uVar87;
  auVar282._24_8_ = uVar87;
  auVar5 = vshufps_avx(auVar91,auVar91,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vmovshdup_avx(auVar10);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar7 = vshufps_avx(auVar10,auVar10,0xaa);
  uVar87 = auVar7._0_8_;
  auVar269._8_8_ = uVar87;
  auVar269._0_8_ = uVar87;
  auVar269._16_8_ = uVar87;
  auVar269._24_8_ = uVar87;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_520 = auVar5._0_4_;
  fStack_51c = auVar5._4_4_;
  auVar5 = vmovshdup_avx(auVar90);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vshufps_avx(auVar90,auVar90,0xaa);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vshufps_avx(auVar90,auVar90,0xff);
  local_260 = auVar5._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar248 = ZEXT3264(local_aa0);
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar117 * fVar117)),_local_a80,_local_a80);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar288,auVar288);
  uVar83 = auVar5._0_4_;
  local_280._4_4_ = uVar83;
  local_280._0_4_ = uVar83;
  local_280._8_4_ = uVar83;
  local_280._12_4_ = uVar83;
  local_280._16_4_ = uVar83;
  local_280._20_4_ = uVar83;
  local_280._24_4_ = uVar83;
  local_280._28_4_ = uVar83;
  auVar262 = ZEXT3264(local_280);
  fVar117 = *(float *)(ray + k * 4 + 0x60);
  local_8b0 = ZEXT416((uint)local_320);
  local_320 = fVar117 - local_320;
  auVar233 = ZEXT3264(local_980);
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_580 = uVar76;
  uStack_57c = uVar76;
  uStack_578 = uVar76;
  uStack_574 = uVar76;
  uStack_570 = uVar76;
  uStack_56c = uVar76;
  uStack_568 = uVar76;
  uStack_564 = uVar76;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  uVar79 = 0;
  uVar80 = 0;
  local_720 = 1;
  uVar83 = auVar9._0_4_;
  local_2e0._4_4_ = uVar83;
  local_2e0._0_4_ = uVar83;
  local_2e0._8_4_ = uVar83;
  local_2e0._12_4_ = uVar83;
  local_2e0._16_4_ = uVar83;
  local_2e0._20_4_ = uVar83;
  local_2e0._24_4_ = uVar83;
  local_2e0._28_4_ = uVar83;
  fVar119 = auVar91._0_4_;
  local_300._4_4_ = fVar119;
  local_300._0_4_ = fVar119;
  local_300._8_4_ = fVar119;
  local_300._12_4_ = fVar119;
  local_300._16_4_ = fVar119;
  local_300._20_4_ = fVar119;
  local_300._24_4_ = fVar119;
  local_300._28_4_ = fVar119;
  fVar198 = auVar10._0_4_;
  fVar118 = auVar90._0_4_;
  local_2a0 = fVar118;
  fStack_29c = fVar118;
  fStack_298 = fVar118;
  fStack_294 = fVar118;
  fStack_290 = fVar118;
  fStack_28c = fVar118;
  fStack_288 = fVar118;
  fStack_284 = fVar118;
  auVar17._4_4_ = uStack_81c;
  auVar17._0_4_ = local_820;
  auVar17._8_4_ = uStack_818;
  auVar17._12_4_ = uStack_814;
  auVar17._16_4_ = uStack_810;
  auVar17._20_4_ = uStack_80c;
  auVar17._24_4_ = uStack_808;
  auVar17._28_4_ = uStack_804;
  local_560 = vandps_avx(local_280,auVar17);
  auVar5 = vsqrtss_avx(local_9d0,local_9d0);
  auVar8 = vsqrtss_avx(local_9d0,local_9d0);
  local_8a0 = ZEXT816(0x3f80000000000000);
  local_540 = fVar198;
  fStack_53c = fVar198;
  fStack_538 = fVar198;
  fStack_534 = fVar198;
  fStack_530 = fVar198;
  fStack_52c = fVar198;
  fStack_528 = fVar198;
  fStack_524 = fVar198;
  fStack_518 = local_520;
  fStack_514 = fStack_51c;
  fStack_510 = local_520;
  fStack_50c = fStack_51c;
  fStack_508 = local_520;
  fStack_504 = fStack_51c;
  do {
    auVar96 = vmovshdup_avx(local_8a0);
    local_920._0_4_ = local_8a0._0_4_;
    fVar152 = auVar96._0_4_ - (float)local_920._0_4_;
    fVar156 = fVar152 * 0.04761905;
    local_920._4_4_ = (float)local_920._0_4_;
    local_920._8_4_ = (float)local_920._0_4_;
    local_920._12_4_ = (float)local_920._0_4_;
    local_920._16_4_ = local_920._0_4_;
    local_920._20_4_ = local_920._0_4_;
    local_920._24_4_ = local_920._0_4_;
    local_920._28_4_ = local_920._0_4_;
    local_960._4_4_ = fVar152;
    local_960._0_4_ = fVar152;
    local_960._8_4_ = fVar152;
    local_960._12_4_ = fVar152;
    local_960._16_4_ = fVar152;
    local_960._20_4_ = fVar152;
    local_960._24_4_ = fVar152;
    local_960._28_4_ = fVar152;
    auVar96 = vfmadd231ps_fma(local_920,local_960,_DAT_02020f20);
    auVar141._8_4_ = 0x3f800000;
    auVar141._0_8_ = &DAT_3f8000003f800000;
    auVar141._12_4_ = 0x3f800000;
    auVar141._16_4_ = 0x3f800000;
    auVar141._20_4_ = 0x3f800000;
    auVar141._24_4_ = 0x3f800000;
    auVar141._28_4_ = 0x3f800000;
    auVar110 = vsubps_avx(auVar141,ZEXT1632(auVar96));
    fVar120 = auVar96._0_4_;
    auVar277._0_4_ = local_300._0_4_ * fVar120;
    fVar292 = auVar96._4_4_;
    auVar277._4_4_ = local_300._4_4_ * fVar292;
    fVar151 = auVar96._8_4_;
    auVar277._8_4_ = local_300._8_4_ * fVar151;
    fVar86 = auVar96._12_4_;
    auVar277._12_4_ = local_300._12_4_ * fVar86;
    auVar277._16_4_ = local_300._16_4_ * 0.0;
    auVar277._20_4_ = local_300._20_4_ * 0.0;
    auVar277._28_36_ = auVar276._28_36_;
    auVar277._24_4_ = local_300._24_4_ * 0.0;
    auVar74._8_8_ = uStack_1b8;
    auVar74._0_8_ = local_1c0;
    auVar74._16_8_ = uStack_1b0;
    auVar74._24_8_ = uStack_1a8;
    auVar276._0_4_ = (float)local_1c0 * fVar120;
    auVar276._4_4_ = (float)((ulong)local_1c0 >> 0x20) * fVar292;
    auVar276._8_4_ = (float)uStack_1b8 * fVar151;
    auVar276._12_4_ = (float)((ulong)uStack_1b8 >> 0x20) * fVar86;
    auVar276._16_4_ = (float)uStack_1b0 * 0.0;
    auVar276._20_4_ = (float)((ulong)uStack_1b0 >> 0x20) * 0.0;
    auVar276._28_36_ = auVar248._28_36_;
    auVar276._24_4_ = (float)uStack_1a8 * 0.0;
    fVar293 = auVar6._0_4_;
    auVar267._0_4_ = fVar293 * fVar120;
    fVar153 = auVar6._4_4_;
    auVar267._4_4_ = fVar153 * fVar292;
    auVar267._8_4_ = fVar293 * fVar151;
    auVar267._12_4_ = fVar153 * fVar86;
    auVar267._16_4_ = fVar293 * 0.0;
    auVar267._20_4_ = fVar153 * 0.0;
    auVar267._28_36_ = auVar266._28_36_;
    auVar267._24_4_ = fVar293 * 0.0;
    auVar73._8_8_ = uStack_1d8;
    auVar73._0_8_ = local_1e0;
    auVar73._16_8_ = uStack_1d0;
    auVar73._24_8_ = uStack_1c8;
    auVar13._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar292;
    auVar13._0_4_ = (float)local_1e0 * fVar120;
    auVar13._8_4_ = (float)uStack_1d8 * fVar151;
    auVar13._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar86;
    auVar13._16_4_ = (float)uStack_1d0 * 0.0;
    auVar13._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar13._24_4_ = (float)uStack_1c8 * 0.0;
    auVar13._28_4_ = fVar152;
    auVar96 = vfmadd231ps_fma(auVar277._0_32_,auVar110,local_2e0);
    auVar122 = vfmadd231ps_fma(auVar276._0_32_,auVar110,auVar233._0_32_);
    auVar89 = vfmadd231ps_fma(auVar267._0_32_,auVar110,local_640);
    auVar75._8_8_ = uStack_198;
    auVar75._0_8_ = local_1a0;
    auVar75._16_8_ = uStack_190;
    auVar75._24_8_ = uStack_188;
    auVar123 = vfmadd231ps_fma(auVar13,auVar110,auVar75);
    auVar266._0_4_ = local_540 * fVar120;
    auVar266._4_4_ = fStack_53c * fVar292;
    auVar266._8_4_ = fStack_538 * fVar151;
    auVar266._12_4_ = fStack_534 * fVar86;
    auVar266._16_4_ = fStack_530 * 0.0;
    auVar266._20_4_ = fStack_52c * 0.0;
    auVar266._28_36_ = auVar262._28_36_;
    auVar266._24_4_ = fStack_528 * 0.0;
    auVar190._8_8_ = uStack_1f8;
    auVar190._0_8_ = local_200;
    auVar190._16_8_ = uStack_1f0;
    auVar190._24_8_ = uStack_1e8;
    auVar248._0_4_ = (float)local_200 * fVar120;
    auVar248._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar292;
    auVar248._8_4_ = (float)uStack_1f8 * fVar151;
    auVar248._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar86;
    auVar248._16_4_ = (float)uStack_1f0 * 0.0;
    auVar248._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar248._28_36_ = auVar233._28_36_;
    auVar248._24_4_ = (float)uStack_1e8 * 0.0;
    fVar152 = auVar7._0_4_;
    fVar293 = auVar7._4_4_;
    auVar14._4_4_ = fVar293 * fVar292;
    auVar14._0_4_ = fVar152 * fVar120;
    auVar14._8_4_ = fVar152 * fVar151;
    auVar14._12_4_ = fVar293 * fVar86;
    auVar14._16_4_ = fVar152 * 0.0;
    auVar14._20_4_ = fVar293 * 0.0;
    auVar14._24_4_ = fVar152 * 0.0;
    auVar14._28_4_ = fStack_524;
    auVar193._4_4_ = fVar292 * fStack_51c;
    auVar193._0_4_ = fVar120 * local_520;
    auVar193._8_4_ = fVar151 * fStack_518;
    auVar193._12_4_ = fVar86 * fStack_514;
    auVar193._16_4_ = fStack_510 * 0.0;
    auVar193._20_4_ = fStack_50c * 0.0;
    auVar193._24_4_ = fStack_508 * 0.0;
    auVar193._28_4_ = local_640._28_4_;
    auVar176 = vfmadd231ps_fma(auVar266._0_32_,auVar110,local_300);
    auVar138 = vfmadd231ps_fma(auVar248._0_32_,auVar110,auVar74);
    auVar88 = vfmadd231ps_fma(auVar14,auVar110,auVar282);
    auVar121 = vfmadd231ps_fma(auVar193,auVar110,auVar73);
    auVar161._4_4_ = fVar292 * fStack_29c;
    auVar161._0_4_ = fVar120 * local_2a0;
    auVar161._8_4_ = fVar151 * fStack_298;
    auVar161._12_4_ = fVar86 * fStack_294;
    auVar161._16_4_ = fStack_290 * 0.0;
    auVar161._20_4_ = fStack_28c * 0.0;
    auVar161._24_4_ = fStack_288 * 0.0;
    auVar161._28_4_ = (int)((ulong)uStack_1a8 >> 0x20);
    auVar194._4_4_ = fVar292 * local_220._4_4_;
    auVar194._0_4_ = fVar120 * (float)local_220;
    auVar194._8_4_ = fVar151 * (float)uStack_218;
    auVar194._12_4_ = fVar86 * uStack_218._4_4_;
    auVar194._16_4_ = (float)uStack_210 * 0.0;
    auVar194._20_4_ = uStack_210._4_4_ * 0.0;
    auVar194._24_4_ = (float)uStack_208 * 0.0;
    auVar194._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar163._28_4_ = fVar153;
    auVar163._0_28_ =
         ZEXT1628(CONCAT412(auVar176._12_4_ * fVar86,
                            CONCAT48(auVar176._8_4_ * fVar151,
                                     CONCAT44(auVar176._4_4_ * fVar292,auVar176._0_4_ * fVar120))));
    auVar96 = vfmadd231ps_fma(auVar163,auVar110,ZEXT1632(auVar96));
    auVar122 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar138._12_4_,
                                                  CONCAT48(fVar151 * auVar138._8_4_,
                                                           CONCAT44(fVar292 * auVar138._4_4_,
                                                                    fVar120 * auVar138._0_4_)))),
                               auVar110,ZEXT1632(auVar122));
    auVar15._28_4_ = local_300._28_4_;
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(fVar86 * auVar88._12_4_,
                            CONCAT48(fVar151 * auVar88._8_4_,
                                     CONCAT44(fVar292 * auVar88._4_4_,fVar120 * auVar88._0_4_))));
    auVar89 = vfmadd231ps_fma(auVar15,auVar110,ZEXT1632(auVar89));
    auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar121._12_4_,
                                                  CONCAT48(fVar151 * auVar121._8_4_,
                                                           CONCAT44(fVar292 * auVar121._4_4_,
                                                                    fVar120 * auVar121._0_4_)))),
                               auVar110,ZEXT1632(auVar123));
    auVar244._0_4_ = fVar120 * (float)local_240;
    auVar244._4_4_ = fVar292 * local_240._4_4_;
    auVar244._8_4_ = fVar151 * (float)uStack_238;
    auVar244._12_4_ = fVar86 * uStack_238._4_4_;
    auVar244._16_4_ = (float)uStack_230 * 0.0;
    auVar244._20_4_ = uStack_230._4_4_ * 0.0;
    auVar244._24_4_ = (float)uStack_228 * 0.0;
    auVar244._28_4_ = 0;
    auVar18._4_4_ = fStack_53c;
    auVar18._0_4_ = local_540;
    auVar18._8_4_ = fStack_538;
    auVar18._12_4_ = fStack_534;
    auVar18._16_4_ = fStack_530;
    auVar18._20_4_ = fStack_52c;
    auVar18._24_4_ = fStack_528;
    auVar18._28_4_ = fStack_524;
    auVar200 = vfmadd231ps_fma(auVar161,auVar110,auVar18);
    auVar176 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar200._12_4_ * fVar86,
                                                  CONCAT48(auVar200._8_4_ * fVar151,
                                                           CONCAT44(auVar200._4_4_ * fVar292,
                                                                    auVar200._0_4_ * fVar120)))),
                               auVar110,ZEXT1632(auVar176));
    auVar258._0_4_ = fVar120 * (float)local_260;
    auVar258._4_4_ = fVar292 * local_260._4_4_;
    auVar258._8_4_ = fVar151 * (float)uStack_258;
    auVar258._12_4_ = fVar86 * uStack_258._4_4_;
    auVar258._16_4_ = (float)uStack_250 * 0.0;
    auVar258._20_4_ = uStack_250._4_4_ * 0.0;
    auVar258._24_4_ = (float)uStack_248 * 0.0;
    auVar258._28_4_ = 0;
    auVar200 = vfmadd231ps_fma(auVar194,auVar110,auVar190);
    auVar216 = vfmadd231ps_fma(auVar244,auVar110,auVar269);
    auVar100._4_4_ = fStack_51c;
    auVar100._0_4_ = local_520;
    auVar100._8_4_ = fStack_518;
    auVar100._12_4_ = fStack_514;
    auVar100._16_4_ = fStack_510;
    auVar100._20_4_ = fStack_50c;
    auVar100._24_4_ = fStack_508;
    auVar100._28_4_ = fStack_504;
    auVar217 = vfmadd231ps_fma(auVar258,auVar110,auVar100);
    auVar228._28_4_ = fVar293;
    auVar228._0_28_ =
         ZEXT1628(CONCAT412(auVar217._12_4_ * fVar86,
                            CONCAT48(auVar217._8_4_ * fVar151,
                                     CONCAT44(auVar217._4_4_ * fVar292,auVar217._0_4_ * fVar120))));
    auVar138 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar200._12_4_ * fVar86,
                                                  CONCAT48(auVar200._8_4_ * fVar151,
                                                           CONCAT44(auVar200._4_4_ * fVar292,
                                                                    auVar200._0_4_ * fVar120)))),
                               auVar110,ZEXT1632(auVar138));
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar86 * auVar216._12_4_,
                                                 CONCAT48(fVar151 * auVar216._8_4_,
                                                          CONCAT44(fVar292 * auVar216._4_4_,
                                                                   fVar120 * auVar216._0_4_)))),
                              auVar110,ZEXT1632(auVar88));
    auVar121 = vfmadd231ps_fma(auVar228,auVar110,ZEXT1632(auVar121));
    auVar16._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(fVar86 * auVar88._12_4_,
                            CONCAT48(fVar151 * auVar88._8_4_,
                                     CONCAT44(fVar292 * auVar88._4_4_,fVar120 * auVar88._0_4_))));
    auVar200 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar176._12_4_ * fVar86,
                                                  CONCAT48(auVar176._8_4_ * fVar151,
                                                           CONCAT44(auVar176._4_4_ * fVar292,
                                                                    auVar176._0_4_ * fVar120)))),
                               auVar110,ZEXT1632(auVar96));
    auVar216 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar138._12_4_ * fVar86,
                                                  CONCAT48(auVar138._8_4_ * fVar151,
                                                           CONCAT44(auVar138._4_4_ * fVar292,
                                                                    auVar138._0_4_ * fVar120)))),
                               auVar110,ZEXT1632(auVar122));
    auVar100 = ZEXT1632(auVar216);
    auVar216 = vfmadd231ps_fma(auVar16,auVar110,ZEXT1632(auVar89));
    auVar217 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar121._12_4_ * fVar86,
                                                  CONCAT48(auVar121._8_4_ * fVar151,
                                                           CONCAT44(auVar121._4_4_ * fVar292,
                                                                    auVar121._0_4_ * fVar120)))),
                               ZEXT1632(auVar123),auVar110);
    auVar17 = vsubps_avx(ZEXT1632(auVar176),ZEXT1632(auVar96));
    auVar110 = vsubps_avx(ZEXT1632(auVar138),ZEXT1632(auVar122));
    auVar102 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar89));
    auVar13 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar123));
    auVar238._0_4_ = fVar156 * auVar17._0_4_ * 3.0;
    auVar238._4_4_ = fVar156 * auVar17._4_4_ * 3.0;
    auVar238._8_4_ = fVar156 * auVar17._8_4_ * 3.0;
    auVar238._12_4_ = fVar156 * auVar17._12_4_ * 3.0;
    auVar238._16_4_ = fVar156 * auVar17._16_4_ * 3.0;
    auVar238._20_4_ = fVar156 * auVar17._20_4_ * 3.0;
    auVar238._24_4_ = fVar156 * auVar17._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    local_740._0_4_ = fVar156 * auVar110._0_4_ * 3.0;
    local_740._4_4_ = fVar156 * auVar110._4_4_ * 3.0;
    local_740._8_4_ = fVar156 * auVar110._8_4_ * 3.0;
    local_740._12_4_ = fVar156 * auVar110._12_4_ * 3.0;
    local_740._16_4_ = fVar156 * auVar110._16_4_ * 3.0;
    local_740._20_4_ = fVar156 * auVar110._20_4_ * 3.0;
    local_740._24_4_ = fVar156 * auVar110._24_4_ * 3.0;
    local_740._28_4_ = 0;
    auVar289._0_4_ = fVar156 * auVar102._0_4_ * 3.0;
    auVar289._4_4_ = fVar156 * auVar102._4_4_ * 3.0;
    auVar289._8_4_ = fVar156 * auVar102._8_4_ * 3.0;
    auVar289._12_4_ = fVar156 * auVar102._12_4_ * 3.0;
    auVar289._16_4_ = fVar156 * auVar102._16_4_ * 3.0;
    auVar289._20_4_ = fVar156 * auVar102._20_4_ * 3.0;
    auVar289._24_4_ = fVar156 * auVar102._24_4_ * 3.0;
    auVar289._28_4_ = 0;
    fVar120 = fVar156 * auVar13._0_4_ * 3.0;
    fVar151 = fVar156 * auVar13._4_4_ * 3.0;
    auVar20._4_4_ = fVar151;
    auVar20._0_4_ = fVar120;
    fVar152 = fVar156 * auVar13._8_4_ * 3.0;
    auVar20._8_4_ = fVar152;
    fVar153 = fVar156 * auVar13._12_4_ * 3.0;
    auVar20._12_4_ = fVar153;
    fVar154 = fVar156 * auVar13._16_4_ * 3.0;
    auVar20._16_4_ = fVar154;
    fVar155 = fVar156 * auVar13._20_4_ * 3.0;
    auVar20._20_4_ = fVar155;
    fVar156 = fVar156 * auVar13._24_4_ * 3.0;
    auVar20._24_4_ = fVar156;
    auVar20._28_4_ = auVar17._28_4_;
    auVar190 = ZEXT1632(auVar200);
    auVar193 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar200));
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar100);
    _local_900 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar216));
    auVar14 = vsubps_avx(auVar193,auVar190);
    auVar161 = vsubps_avx(_local_900,ZEXT1632(auVar216));
    fVar172 = auVar161._0_4_;
    fVar173 = auVar161._4_4_;
    auVar19._4_4_ = fVar173 * auVar238._4_4_;
    auVar19._0_4_ = fVar172 * auVar238._0_4_;
    fVar174 = auVar161._8_4_;
    auVar19._8_4_ = fVar174 * auVar238._8_4_;
    fVar175 = auVar161._12_4_;
    auVar19._12_4_ = fVar175 * auVar238._12_4_;
    fVar214 = auVar161._16_4_;
    auVar19._16_4_ = fVar214 * auVar238._16_4_;
    fVar215 = auVar161._20_4_;
    auVar19._20_4_ = fVar215 * auVar238._20_4_;
    fVar234 = auVar161._24_4_;
    auVar19._24_4_ = fVar234 * auVar238._24_4_;
    auVar19._28_4_ = local_900._28_4_;
    auVar96 = vfmsub231ps_fma(auVar19,auVar289,auVar14);
    auVar194 = vsubps_avx(auVar18,auVar100);
    fVar271 = auVar14._0_4_;
    fVar272 = auVar14._4_4_;
    auVar103._4_4_ = fVar272 * local_740._4_4_;
    auVar103._0_4_ = fVar271 * local_740._0_4_;
    fVar273 = auVar14._8_4_;
    auVar103._8_4_ = fVar273 * local_740._8_4_;
    fVar278 = auVar14._12_4_;
    auVar103._12_4_ = fVar278 * local_740._12_4_;
    fVar279 = auVar14._16_4_;
    auVar103._16_4_ = fVar279 * local_740._16_4_;
    fVar280 = auVar14._20_4_;
    auVar103._20_4_ = fVar280 * local_740._20_4_;
    fVar281 = auVar14._24_4_;
    auVar103._24_4_ = fVar281 * local_740._24_4_;
    auVar103._28_4_ = auVar193._28_4_;
    auVar122 = vfmsub231ps_fma(auVar103,auVar238,auVar194);
    auVar96 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar122._12_4_ * auVar122._12_4_,
                                                 CONCAT48(auVar122._8_4_ * auVar122._8_4_,
                                                          CONCAT44(auVar122._4_4_ * auVar122._4_4_,
                                                                   auVar122._0_4_ * auVar122._0_4_))
                                                )),ZEXT1632(auVar96),ZEXT1632(auVar96));
    fVar199 = auVar194._0_4_;
    fVar210 = auVar194._4_4_;
    auVar270._4_4_ = fVar210 * auVar289._4_4_;
    auVar270._0_4_ = fVar199 * auVar289._0_4_;
    fVar211 = auVar194._8_4_;
    auVar270._8_4_ = fVar211 * auVar289._8_4_;
    fVar212 = auVar194._12_4_;
    auVar270._12_4_ = fVar212 * auVar289._12_4_;
    fVar213 = auVar194._16_4_;
    auVar270._16_4_ = fVar213 * auVar289._16_4_;
    fVar242 = auVar194._20_4_;
    auVar270._20_4_ = fVar242 * auVar289._20_4_;
    fVar249 = auVar194._24_4_;
    auVar270._24_4_ = fVar249 * auVar289._24_4_;
    auVar270._28_4_ = auVar18._28_4_;
    auVar89 = vfmsub231ps_fma(auVar270,local_740,auVar161);
    auVar191._0_4_ = fVar172 * fVar172;
    auVar191._4_4_ = fVar173 * fVar173;
    auVar191._8_4_ = fVar174 * fVar174;
    auVar191._12_4_ = fVar175 * fVar175;
    auVar191._16_4_ = fVar214 * fVar214;
    auVar191._20_4_ = fVar215 * fVar215;
    auVar191._24_4_ = fVar234 * fVar234;
    auVar191._28_4_ = 0;
    auVar122 = vfmadd231ps_fma(auVar191,auVar194,auVar194);
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar14,auVar14);
    auVar110 = vrcpps_avx(ZEXT1632(auVar122));
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar96),ZEXT1632(auVar89),ZEXT1632(auVar89));
    auVar265._8_4_ = 0x3f800000;
    auVar265._0_8_ = &DAT_3f8000003f800000;
    auVar265._12_4_ = 0x3f800000;
    auVar265._16_4_ = 0x3f800000;
    auVar265._20_4_ = 0x3f800000;
    auVar265._24_4_ = 0x3f800000;
    auVar265._28_4_ = 0x3f800000;
    auVar96 = vfnmadd213ps_fma(auVar110,ZEXT1632(auVar122),auVar265);
    auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar110,auVar110);
    auVar19 = vpermps_avx2(_DAT_0205d4a0,auVar238);
    local_a40 = vpermps_avx2(_DAT_0205d4a0,auVar289);
    auVar296._4_4_ = fVar173 * auVar19._4_4_;
    auVar296._0_4_ = fVar172 * auVar19._0_4_;
    auVar296._8_4_ = fVar174 * auVar19._8_4_;
    auVar296._12_4_ = fVar175 * auVar19._12_4_;
    auVar296._16_4_ = fVar214 * auVar19._16_4_;
    auVar296._20_4_ = fVar215 * auVar19._20_4_;
    auVar296._24_4_ = fVar234 * auVar19._24_4_;
    auVar296._28_4_ = auVar110._28_4_;
    auVar123 = vfmsub231ps_fma(auVar296,local_a40,auVar14);
    local_a60 = vpermps_avx2(_DAT_0205d4a0,local_740);
    auVar4._4_4_ = fVar272 * local_a60._4_4_;
    auVar4._0_4_ = fVar271 * local_a60._0_4_;
    auVar4._8_4_ = fVar273 * local_a60._8_4_;
    auVar4._12_4_ = fVar278 * local_a60._12_4_;
    auVar4._16_4_ = fVar279 * local_a60._16_4_;
    auVar4._20_4_ = fVar280 * local_a60._20_4_;
    auVar4._24_4_ = fVar281 * local_a60._24_4_;
    auVar4._28_4_ = 0;
    auVar176 = vfmsub231ps_fma(auVar4,auVar19,auVar194);
    auVar123 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar176._12_4_ * auVar176._12_4_,
                                                  CONCAT48(auVar176._8_4_ * auVar176._8_4_,
                                                           CONCAT44(auVar176._4_4_ * auVar176._4_4_,
                                                                    auVar176._0_4_ * auVar176._0_4_)
                                                          ))),ZEXT1632(auVar123),ZEXT1632(auVar123))
    ;
    fVar292 = local_a40._0_4_;
    auVar225._0_4_ = fVar199 * fVar292;
    fVar86 = local_a40._4_4_;
    auVar225._4_4_ = fVar210 * fVar86;
    fVar293 = local_a40._8_4_;
    auVar225._8_4_ = fVar211 * fVar293;
    fVar294 = local_a40._12_4_;
    auVar225._12_4_ = fVar212 * fVar294;
    fVar298 = local_a40._16_4_;
    auVar225._16_4_ = fVar213 * fVar298;
    fVar299 = local_a40._20_4_;
    auVar225._20_4_ = fVar242 * fVar299;
    fVar300 = local_a40._24_4_;
    auVar225._24_4_ = fVar249 * fVar300;
    auVar225._28_4_ = 0;
    auVar176 = vfmsub231ps_fma(auVar225,local_a60,auVar161);
    auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),ZEXT1632(auVar176),ZEXT1632(auVar176));
    auVar110 = vmaxps_avx(ZEXT1632(CONCAT412(auVar89._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar89._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar89._4_4_ * auVar96._4_4_,
                                                               auVar89._0_4_ * auVar96._0_4_)))),
                          ZEXT1632(CONCAT412(auVar123._12_4_ * auVar96._12_4_,
                                             CONCAT48(auVar123._8_4_ * auVar96._8_4_,
                                                      CONCAT44(auVar123._4_4_ * auVar96._4_4_,
                                                               auVar123._0_4_ * auVar96._0_4_)))));
    local_780._0_4_ = auVar217._0_4_ + fVar120;
    local_780._4_4_ = auVar217._4_4_ + fVar151;
    local_780._8_4_ = auVar217._8_4_ + fVar152;
    local_780._12_4_ = auVar217._12_4_ + fVar153;
    local_780._16_4_ = fVar154 + 0.0;
    local_780._20_4_ = fVar155 + 0.0;
    local_780._24_4_ = fVar156 + 0.0;
    local_780._28_4_ = auVar17._28_4_ + 0.0;
    local_760 = ZEXT1632(auVar217);
    auVar17 = vsubps_avx(local_760,auVar20);
    local_7a0 = vpermps_avx2(_DAT_0205d4a0,auVar17);
    auVar20 = vpermps_avx2(_DAT_0205d4a0,local_760);
    auStack_7b0 = auVar20._16_16_;
    auVar17 = vmaxps_avx(local_760,local_780);
    auVar102 = vmaxps_avx(local_7a0,auVar20);
    auVar13 = vrsqrtps_avx(ZEXT1632(auVar122));
    auVar17 = vmaxps_avx(auVar17,auVar102);
    fVar120 = auVar13._0_4_;
    fVar151 = auVar13._4_4_;
    fVar156 = auVar13._8_4_;
    fVar152 = auVar13._12_4_;
    fVar153 = auVar13._16_4_;
    fVar154 = auVar13._20_4_;
    fVar155 = auVar13._24_4_;
    auVar11._4_4_ = fVar151 * fVar151 * fVar151 * auVar122._4_4_ * -0.5;
    auVar11._0_4_ = fVar120 * fVar120 * fVar120 * auVar122._0_4_ * -0.5;
    auVar11._8_4_ = fVar156 * fVar156 * fVar156 * auVar122._8_4_ * -0.5;
    auVar11._12_4_ = fVar152 * fVar152 * fVar152 * auVar122._12_4_ * -0.5;
    auVar11._16_4_ = fVar153 * fVar153 * fVar153 * -0.0;
    auVar11._20_4_ = fVar154 * fVar154 * fVar154 * -0.0;
    auVar11._24_4_ = fVar155 * fVar155 * fVar155 * -0.0;
    auVar11._28_4_ = auVar19._28_4_;
    auVar101._8_4_ = 0x3fc00000;
    auVar101._0_8_ = 0x3fc000003fc00000;
    auVar101._12_4_ = 0x3fc00000;
    auVar101._16_4_ = 0x3fc00000;
    auVar101._20_4_ = 0x3fc00000;
    auVar101._24_4_ = 0x3fc00000;
    auVar101._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_fma(auVar11,auVar101,auVar13);
    auVar266 = ZEXT1664(auVar96);
    fVar151 = auVar96._0_4_;
    fVar156 = auVar96._4_4_;
    auVar12._4_4_ = fVar210 * fVar156;
    auVar12._0_4_ = fVar199 * fVar151;
    fVar153 = auVar96._8_4_;
    auVar12._8_4_ = fVar211 * fVar153;
    fVar155 = auVar96._12_4_;
    auVar12._12_4_ = fVar212 * fVar155;
    auVar12._16_4_ = fVar213 * 0.0;
    auVar12._20_4_ = fVar242 * 0.0;
    auVar12._24_4_ = fVar249 * 0.0;
    auVar12._28_4_ = 0;
    fVar242 = local_aa0._0_4_;
    fVar249 = local_aa0._4_4_;
    auVar21._4_4_ = fVar249 * fVar173 * fVar156;
    auVar21._0_4_ = fVar242 * fVar172 * fVar151;
    fVar250 = local_aa0._8_4_;
    auVar21._8_4_ = fVar250 * fVar174 * fVar153;
    fVar251 = local_aa0._12_4_;
    auVar21._12_4_ = fVar251 * fVar175 * fVar155;
    fVar252 = local_aa0._16_4_;
    auVar21._16_4_ = fVar252 * fVar214 * 0.0;
    fVar253 = local_aa0._20_4_;
    auVar21._20_4_ = fVar253 * fVar215 * 0.0;
    fVar254 = local_aa0._24_4_;
    auVar21._24_4_ = fVar254 * fVar234 * 0.0;
    auVar21._28_4_ = auVar161._28_4_;
    auVar96 = vfmadd231ps_fma(auVar21,auVar12,_local_a80);
    auVar296 = ZEXT1632(auVar216);
    auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar163 = vsubps_avx(auVar102,auVar296);
    fVar199 = auVar163._0_4_;
    fVar210 = auVar163._4_4_;
    auVar22._4_4_ = fVar210 * fVar173 * fVar156;
    auVar22._0_4_ = fVar199 * fVar172 * fVar151;
    fVar211 = auVar163._8_4_;
    auVar22._8_4_ = fVar211 * fVar174 * fVar153;
    fVar212 = auVar163._12_4_;
    auVar22._12_4_ = fVar212 * fVar175 * fVar155;
    fVar213 = auVar163._16_4_;
    auVar22._16_4_ = fVar213 * fVar214 * 0.0;
    fVar214 = auVar163._20_4_;
    auVar22._20_4_ = fVar214 * fVar215 * 0.0;
    fVar215 = auVar163._24_4_;
    auVar22._24_4_ = fVar215 * fVar234 * 0.0;
    auVar22._28_4_ = auVar194._28_4_;
    auVar15 = vsubps_avx(auVar102,auVar100);
    auVar122 = vfmadd231ps_fma(auVar22,auVar15,auVar12);
    auVar23._4_4_ = fVar272 * fVar156;
    auVar23._0_4_ = fVar271 * fVar151;
    auVar23._8_4_ = fVar273 * fVar153;
    auVar23._12_4_ = fVar278 * fVar155;
    auVar23._16_4_ = fVar279 * 0.0;
    auVar23._20_4_ = fVar280 * 0.0;
    auVar23._24_4_ = fVar281 * 0.0;
    auVar23._28_4_ = auVar13._28_4_;
    auVar96 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar23,auVar288);
    auVar103 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar228 = vsubps_avx(auVar103,auVar190);
    auVar122 = vfmadd231ps_fma(ZEXT1632(auVar122),auVar228,auVar23);
    auVar24._4_4_ = fVar249 * fVar210;
    auVar24._0_4_ = fVar242 * fVar199;
    auVar24._8_4_ = fVar250 * fVar211;
    auVar24._12_4_ = fVar251 * fVar212;
    auVar24._16_4_ = fVar252 * fVar213;
    auVar24._20_4_ = fVar253 * fVar214;
    auVar24._24_4_ = fVar254 * fVar215;
    auVar24._28_4_ = auVar13._28_4_;
    auVar89 = vfmadd231ps_fma(auVar24,_local_a80,auVar15);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar288,auVar228);
    fVar120 = auVar122._0_4_;
    fVar234 = auVar96._0_4_;
    fVar152 = auVar122._4_4_;
    fVar271 = auVar96._4_4_;
    fVar154 = auVar122._8_4_;
    fVar272 = auVar96._8_4_;
    fVar172 = auVar122._12_4_;
    fVar273 = auVar96._12_4_;
    auVar25._28_4_ = fVar85;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar273 * fVar172,
                            CONCAT48(fVar272 * fVar154,CONCAT44(fVar271 * fVar152,fVar234 * fVar120)
                                    )));
    auVar13 = vsubps_avx(ZEXT1632(auVar89),auVar25);
    auVar26._4_4_ = fVar210 * fVar210;
    auVar26._0_4_ = fVar199 * fVar199;
    auVar26._8_4_ = fVar211 * fVar211;
    auVar26._12_4_ = fVar212 * fVar212;
    auVar26._16_4_ = fVar213 * fVar213;
    auVar26._20_4_ = fVar214 * fVar214;
    auVar26._24_4_ = fVar215 * fVar215;
    auVar26._28_4_ = fVar85;
    auVar89 = vfmadd231ps_fma(auVar26,auVar15,auVar15);
    auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar228,auVar228);
    auVar27._28_4_ = auVar14._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar172 * fVar172,
                            CONCAT48(fVar154 * fVar154,CONCAT44(fVar152 * fVar152,fVar120 * fVar120)
                                    )));
    local_7e0 = vsubps_avx(ZEXT1632(auVar89),auVar27);
    auVar102 = vsqrtps_avx(auVar110);
    fVar120 = (auVar17._0_4_ + auVar102._0_4_) * 1.0000002;
    fVar152 = (auVar17._4_4_ + auVar102._4_4_) * 1.0000002;
    fVar154 = (auVar17._8_4_ + auVar102._8_4_) * 1.0000002;
    fVar172 = (auVar17._12_4_ + auVar102._12_4_) * 1.0000002;
    fVar173 = (auVar17._16_4_ + auVar102._16_4_) * 1.0000002;
    fVar174 = (auVar17._20_4_ + auVar102._20_4_) * 1.0000002;
    fVar175 = (auVar17._24_4_ + auVar102._24_4_) * 1.0000002;
    auVar28._4_4_ = fVar152 * fVar152;
    auVar28._0_4_ = fVar120 * fVar120;
    auVar28._8_4_ = fVar154 * fVar154;
    auVar28._12_4_ = fVar172 * fVar172;
    auVar28._16_4_ = fVar173 * fVar173;
    auVar28._20_4_ = fVar174 * fVar174;
    auVar28._24_4_ = fVar175 * fVar175;
    auVar28._28_4_ = auVar17._28_4_ + auVar102._28_4_;
    auVar259._0_4_ = auVar13._0_4_ + auVar13._0_4_;
    auVar259._4_4_ = auVar13._4_4_ + auVar13._4_4_;
    auVar259._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    auVar259._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    auVar259._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    auVar259._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    auVar259._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    auVar259._28_4_ = auVar13._28_4_ + auVar13._28_4_;
    auVar13 = vsubps_avx(local_7e0,auVar28);
    auVar270 = ZEXT1632(auVar96);
    auVar29._28_4_ = auVar17._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar273 * fVar273,
                            CONCAT48(fVar272 * fVar272,CONCAT44(fVar271 * fVar271,fVar234 * fVar234)
                                    )));
    auVar17 = vsubps_avx(local_280,auVar29);
    auVar30._4_4_ = auVar259._4_4_ * auVar259._4_4_;
    auVar30._0_4_ = auVar259._0_4_ * auVar259._0_4_;
    auVar30._8_4_ = auVar259._8_4_ * auVar259._8_4_;
    auVar30._12_4_ = auVar259._12_4_ * auVar259._12_4_;
    auVar30._16_4_ = auVar259._16_4_ * auVar259._16_4_;
    auVar30._20_4_ = auVar259._20_4_ * auVar259._20_4_;
    auVar30._24_4_ = auVar259._24_4_ * auVar259._24_4_;
    auVar30._28_4_ = 0x3f800002;
    fVar152 = auVar17._0_4_;
    fVar154 = auVar17._4_4_;
    fVar172 = auVar17._8_4_;
    fVar173 = auVar17._12_4_;
    fVar174 = auVar17._16_4_;
    fVar175 = auVar17._20_4_;
    fVar234 = auVar17._24_4_;
    auVar31._4_4_ = auVar13._4_4_ * fVar154 * 4.0;
    auVar31._0_4_ = auVar13._0_4_ * fVar152 * 4.0;
    auVar31._8_4_ = auVar13._8_4_ * fVar172 * 4.0;
    auVar31._12_4_ = auVar13._12_4_ * fVar173 * 4.0;
    auVar31._16_4_ = auVar13._16_4_ * fVar174 * 4.0;
    auVar31._20_4_ = auVar13._20_4_ * fVar175 * 4.0;
    auVar31._24_4_ = auVar13._24_4_ * fVar234 * 4.0;
    auVar31._28_4_ = 0x40800000;
    auVar16 = vsubps_avx(auVar30,auVar31);
    auVar110 = vcmpps_avx(auVar16,auVar103,5);
    auVar103 = ZEXT1632(auVar122);
    fVar120 = auVar17._28_4_;
    if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar110 >> 0x7f,0) == '\0') &&
          (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar110 >> 0xbf,0) == '\0') &&
        (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar110[0x1f])
    {
      auVar260._8_4_ = 0x7f800000;
      auVar260._0_8_ = 0x7f8000007f800000;
      auVar260._12_4_ = 0x7f800000;
      auVar260._16_4_ = 0x7f800000;
      auVar260._20_4_ = 0x7f800000;
      auVar260._24_4_ = 0x7f800000;
      auVar260._28_4_ = 0x7f800000;
      auVar226._8_4_ = 0xff800000;
      auVar226._0_8_ = 0xff800000ff800000;
      auVar226._12_4_ = 0xff800000;
      auVar226._16_4_ = 0xff800000;
      auVar226._20_4_ = 0xff800000;
      auVar226._24_4_ = 0xff800000;
      auVar226._28_4_ = 0xff800000;
      auVar4 = local_280;
    }
    else {
      auVar12 = vsqrtps_avx(auVar16);
      auVar245._0_4_ = fVar152 + fVar152;
      auVar245._4_4_ = fVar154 + fVar154;
      auVar245._8_4_ = fVar172 + fVar172;
      auVar245._12_4_ = fVar173 + fVar173;
      auVar245._16_4_ = fVar174 + fVar174;
      auVar245._20_4_ = fVar175 + fVar175;
      auVar245._24_4_ = fVar234 + fVar234;
      auVar245._28_4_ = fVar120 + fVar120;
      auVar11 = vrcpps_avx(auVar245);
      auVar4 = vcmpps_avx(auVar16,ZEXT832(0) << 0x20,5);
      auVar227._8_4_ = 0x3f800000;
      auVar227._0_8_ = &DAT_3f8000003f800000;
      auVar227._12_4_ = 0x3f800000;
      auVar227._16_4_ = 0x3f800000;
      auVar227._20_4_ = 0x3f800000;
      auVar227._24_4_ = 0x3f800000;
      auVar227._28_4_ = 0x3f800000;
      auVar96 = vfnmadd213ps_fma(auVar245,auVar11,auVar227);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar11,auVar11);
      uVar84 = CONCAT44(auVar259._4_4_,auVar259._0_4_);
      auVar104._0_8_ = uVar84 ^ 0x8000000080000000;
      auVar104._8_4_ = -auVar259._8_4_;
      auVar104._12_4_ = -auVar259._12_4_;
      auVar104._16_4_ = -auVar259._16_4_;
      auVar104._20_4_ = -auVar259._20_4_;
      auVar104._24_4_ = -auVar259._24_4_;
      auVar104._28_4_ = -auVar259._28_4_;
      auVar16 = vsubps_avx(auVar104,auVar12);
      auVar32._4_4_ = auVar16._4_4_ * auVar96._4_4_;
      auVar32._0_4_ = auVar16._0_4_ * auVar96._0_4_;
      auVar32._8_4_ = auVar16._8_4_ * auVar96._8_4_;
      auVar32._12_4_ = auVar16._12_4_ * auVar96._12_4_;
      auVar32._16_4_ = auVar16._16_4_ * 0.0;
      auVar32._20_4_ = auVar16._20_4_ * 0.0;
      auVar32._24_4_ = auVar16._24_4_ * 0.0;
      auVar32._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar12,auVar259);
      auVar33._4_4_ = auVar16._4_4_ * auVar96._4_4_;
      auVar33._0_4_ = auVar16._0_4_ * auVar96._0_4_;
      auVar33._8_4_ = auVar16._8_4_ * auVar96._8_4_;
      auVar33._12_4_ = auVar16._12_4_ * auVar96._12_4_;
      auVar33._16_4_ = auVar16._16_4_ * 0.0;
      auVar33._20_4_ = auVar16._20_4_ * 0.0;
      auVar33._24_4_ = auVar16._24_4_ * 0.0;
      auVar33._28_4_ = auVar16._28_4_;
      auVar96 = vfmadd213ps_fma(auVar270,auVar32,auVar103);
      local_600 = ZEXT1632(CONCAT412(fVar155 * auVar96._12_4_,
                                     CONCAT48(fVar153 * auVar96._8_4_,
                                              CONCAT44(fVar156 * auVar96._4_4_,
                                                       fVar151 * auVar96._0_4_))));
      auVar96 = vfmadd213ps_fma(auVar270,auVar33,auVar103);
      local_620 = ZEXT1632(CONCAT412(fVar155 * auVar96._12_4_,
                                     CONCAT48(fVar153 * auVar96._8_4_,
                                              CONCAT44(fVar156 * auVar96._4_4_,
                                                       fVar151 * auVar96._0_4_))));
      auVar239._8_4_ = 0x7f800000;
      auVar239._0_8_ = 0x7f8000007f800000;
      auVar239._12_4_ = 0x7f800000;
      auVar239._16_4_ = 0x7f800000;
      auVar239._20_4_ = 0x7f800000;
      auVar239._24_4_ = 0x7f800000;
      auVar239._28_4_ = 0x7f800000;
      auVar260 = vblendvps_avx(auVar239,auVar32,auVar4);
      auVar67._4_4_ = uStack_81c;
      auVar67._0_4_ = local_820;
      auVar67._8_4_ = uStack_818;
      auVar67._12_4_ = uStack_814;
      auVar67._16_4_ = uStack_810;
      auVar67._20_4_ = uStack_80c;
      auVar67._24_4_ = uStack_808;
      auVar67._28_4_ = uStack_804;
      auVar16 = vandps_avx(auVar29,auVar67);
      auVar16 = vmaxps_avx(local_560,auVar16);
      auVar34._4_4_ = auVar16._4_4_ * 1.9073486e-06;
      auVar34._0_4_ = auVar16._0_4_ * 1.9073486e-06;
      auVar34._8_4_ = auVar16._8_4_ * 1.9073486e-06;
      auVar34._12_4_ = auVar16._12_4_ * 1.9073486e-06;
      auVar34._16_4_ = auVar16._16_4_ * 1.9073486e-06;
      auVar34._20_4_ = auVar16._20_4_ * 1.9073486e-06;
      auVar34._24_4_ = auVar16._24_4_ * 1.9073486e-06;
      auVar34._28_4_ = auVar16._28_4_;
      auVar16 = vandps_avx(auVar17,auVar67);
      auVar16 = vcmpps_avx(auVar16,auVar34,1);
      auVar105._8_4_ = 0xff800000;
      auVar105._0_8_ = 0xff800000ff800000;
      auVar105._12_4_ = 0xff800000;
      auVar105._16_4_ = 0xff800000;
      auVar105._20_4_ = 0xff800000;
      auVar105._24_4_ = 0xff800000;
      auVar105._28_4_ = 0xff800000;
      auVar226 = vblendvps_avx(auVar105,auVar33,auVar4);
      auVar11 = auVar4 & auVar16;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar110 = vandps_avx(auVar4,auVar16);
        auVar16 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,2);
        auVar291._8_4_ = 0xff800000;
        auVar291._0_8_ = 0xff800000ff800000;
        auVar291._12_4_ = 0xff800000;
        auVar291._16_4_ = 0xff800000;
        auVar291._20_4_ = 0xff800000;
        auVar291._24_4_ = 0xff800000;
        auVar291._28_4_ = 0xff800000;
        auVar297._8_4_ = 0x7f800000;
        auVar297._0_8_ = 0x7f8000007f800000;
        auVar297._12_4_ = 0x7f800000;
        auVar297._16_4_ = 0x7f800000;
        auVar297._20_4_ = 0x7f800000;
        auVar297._24_4_ = 0x7f800000;
        auVar297._28_4_ = 0x7f800000;
        auVar13 = vblendvps_avx(auVar297,auVar291,auVar16);
        auVar96 = vpackssdw_avx(auVar110._0_16_,auVar110._16_16_);
        auVar11 = vpmovsxwd_avx2(auVar96);
        auVar260 = vblendvps_avx(auVar260,auVar13,auVar11);
        auVar13 = vblendvps_avx(auVar291,auVar297,auVar16);
        auVar226 = vblendvps_avx(auVar226,auVar13,auVar11);
        auVar115._0_8_ = auVar110._0_8_ ^ 0xffffffffffffffff;
        auVar115._8_4_ = auVar110._8_4_ ^ 0xffffffff;
        auVar115._12_4_ = auVar110._12_4_ ^ 0xffffffff;
        auVar115._16_4_ = auVar110._16_4_ ^ 0xffffffff;
        auVar115._20_4_ = auVar110._20_4_ ^ 0xffffffff;
        auVar115._24_4_ = auVar110._24_4_ ^ 0xffffffff;
        auVar115._28_4_ = auVar110._28_4_ ^ 0xffffffff;
        auVar110 = vorps_avx(auVar16,auVar115);
        auVar110 = vandps_avx(auVar4,auVar110);
      }
    }
    auVar262 = ZEXT3264(auVar260);
    auVar276 = ZEXT3264(auVar4);
    auVar248 = ZEXT3264(local_aa0);
    auVar13 = local_2c0 & auVar110;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0x7f,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar13 >> 0xbf,0) == '\0') &&
        (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f]) {
      auVar233 = ZEXT3264(local_980);
    }
    else {
      fVar271 = *(float *)(ray + k * 4 + 0x100) - (float)local_8b0._0_4_;
      auVar106._4_4_ = fVar271;
      auVar106._0_4_ = fVar271;
      auVar106._8_4_ = fVar271;
      auVar106._12_4_ = fVar271;
      auVar106._16_4_ = fVar271;
      auVar106._20_4_ = fVar271;
      auVar106._24_4_ = fVar271;
      auVar106._28_4_ = fVar271;
      auVar16 = vminps_avx(auVar106,auVar226);
      auVar35._4_4_ = auVar289._4_4_ * fVar210;
      auVar35._0_4_ = auVar289._0_4_ * fVar199;
      auVar35._8_4_ = auVar289._8_4_ * fVar211;
      auVar35._12_4_ = auVar289._12_4_ * fVar212;
      auVar35._16_4_ = auVar289._16_4_ * fVar213;
      auVar35._20_4_ = auVar289._20_4_ * fVar214;
      auVar35._24_4_ = auVar289._24_4_ * fVar215;
      auVar35._28_4_ = auVar163._28_4_;
      auVar96 = vfmadd213ps_fma(auVar15,local_740,auVar35);
      auVar122 = vfmadd213ps_fma(auVar228,auVar238,ZEXT1632(auVar96));
      auVar54._4_4_ = auVar289._4_4_ * fVar249;
      auVar54._0_4_ = auVar289._0_4_ * fVar242;
      auVar54._8_4_ = auVar289._8_4_ * fVar250;
      auVar54._12_4_ = auVar289._12_4_ * fVar251;
      auVar54._16_4_ = auVar289._16_4_ * fVar252;
      auVar54._20_4_ = auVar289._20_4_ * fVar253;
      auVar54._24_4_ = auVar289._24_4_ * fVar254;
      auVar54._28_4_ = auVar226._28_4_;
      auVar96 = vfmadd231ps_fma(auVar54,local_740,_local_a80);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar96),auVar238,auVar288);
      auVar68._4_4_ = uStack_81c;
      auVar68._0_4_ = local_820;
      auVar68._8_4_ = uStack_818;
      auVar68._12_4_ = uStack_814;
      auVar68._16_4_ = uStack_810;
      auVar68._20_4_ = uStack_80c;
      auVar68._24_4_ = uStack_808;
      auVar68._28_4_ = uStack_804;
      auVar13 = vandps_avx(auVar68,ZEXT1632(auVar89));
      auVar207._8_4_ = 0x219392ef;
      auVar207._0_8_ = 0x219392ef219392ef;
      auVar207._12_4_ = 0x219392ef;
      auVar207._16_4_ = 0x219392ef;
      auVar207._20_4_ = 0x219392ef;
      auVar207._24_4_ = 0x219392ef;
      auVar207._28_4_ = 0x219392ef;
      auVar163 = vcmpps_avx(auVar13,auVar207,1);
      local_a00._8_4_ = 0x80000000;
      local_a00._0_8_ = 0x8000000080000000;
      local_a00._12_4_ = 0x80000000;
      local_a00._16_4_ = 0x80000000;
      local_a00._20_4_ = 0x80000000;
      local_a00._24_4_ = 0x80000000;
      local_a00._28_4_ = 0x80000000;
      auVar13 = vrcpps_avx(ZEXT1632(auVar89));
      auVar290._8_4_ = 0x3f800000;
      auVar290._0_8_ = &DAT_3f8000003f800000;
      auVar290._12_4_ = 0x3f800000;
      auVar290._16_4_ = 0x3f800000;
      auVar290._20_4_ = 0x3f800000;
      auVar290._24_4_ = 0x3f800000;
      auVar290._28_4_ = 0x3f800000;
      auVar228 = ZEXT1632(auVar89);
      auVar96 = vfnmadd213ps_fma(auVar13,auVar228,auVar290);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar13,auVar13);
      auVar192._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
      auVar192._8_4_ = auVar89._8_4_ ^ 0x80000000;
      auVar192._12_4_ = auVar89._12_4_ ^ 0x80000000;
      auVar192._16_4_ = 0x80000000;
      auVar192._20_4_ = 0x80000000;
      auVar192._24_4_ = 0x80000000;
      auVar192._28_4_ = 0x80000000;
      auVar246._0_4_ = auVar96._0_4_ * -auVar122._0_4_;
      auVar246._4_4_ = auVar96._4_4_ * -auVar122._4_4_;
      auVar246._8_4_ = auVar96._8_4_ * -auVar122._8_4_;
      auVar246._12_4_ = auVar96._12_4_ * -auVar122._12_4_;
      auVar246._16_4_ = 0x80000000;
      auVar246._20_4_ = 0x80000000;
      auVar246._24_4_ = 0x80000000;
      auVar246._28_4_ = 0;
      auVar13 = vcmpps_avx(auVar228,auVar192,1);
      auVar13 = vorps_avx(auVar163,auVar13);
      auVar275._8_4_ = 0xff800000;
      auVar275._0_8_ = 0xff800000ff800000;
      auVar275._12_4_ = 0xff800000;
      auVar275._16_4_ = 0xff800000;
      auVar275._20_4_ = 0xff800000;
      auVar275._24_4_ = 0xff800000;
      auVar275._28_4_ = 0xff800000;
      auVar13 = vblendvps_avx(auVar246,auVar275,auVar13);
      auVar72._4_4_ = fStack_31c;
      auVar72._0_4_ = local_320;
      auVar72._8_4_ = fStack_318;
      auVar72._12_4_ = fStack_314;
      auVar72._16_4_ = fStack_310;
      auVar72._20_4_ = fStack_30c;
      auVar72._24_4_ = fStack_308;
      auVar72._28_4_ = fStack_304;
      auVar15 = vmaxps_avx(auVar72,auVar260);
      auVar15 = vmaxps_avx(auVar15,auVar13);
      auVar13 = vcmpps_avx(auVar228,auVar192,6);
      auVar13 = vorps_avx(auVar163,auVar13);
      auVar229._8_4_ = 0x7f800000;
      auVar229._0_8_ = 0x7f8000007f800000;
      auVar229._12_4_ = 0x7f800000;
      auVar229._16_4_ = 0x7f800000;
      auVar229._20_4_ = 0x7f800000;
      auVar229._24_4_ = 0x7f800000;
      auVar229._28_4_ = 0x7f800000;
      auVar13 = vblendvps_avx(auVar246,auVar229,auVar13);
      auVar228 = vminps_avx(auVar16,auVar13);
      auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar18);
      auVar163 = vsubps_avx(ZEXT832(0) << 0x20,_local_900);
      auVar36._4_4_ = auVar163._4_4_ * fVar86;
      auVar36._0_4_ = auVar163._0_4_ * fVar292;
      auVar36._8_4_ = auVar163._8_4_ * fVar293;
      auVar36._12_4_ = auVar163._12_4_ * fVar294;
      auVar36._16_4_ = auVar163._16_4_ * fVar298;
      auVar36._20_4_ = auVar163._20_4_ * fVar299;
      auVar36._24_4_ = auVar163._24_4_ * fVar300;
      auVar36._28_4_ = auVar163._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar36,local_a60,auVar13);
      auVar13 = vsubps_avx(ZEXT832(0) << 0x20,auVar193);
      auVar122 = vfnmadd231ps_fma(ZEXT1632(auVar96),auVar19,auVar13);
      auVar37._4_4_ = fVar249 * fVar86;
      auVar37._0_4_ = fVar242 * fVar292;
      auVar37._8_4_ = fVar250 * fVar293;
      auVar37._12_4_ = fVar251 * fVar294;
      auVar37._16_4_ = fVar252 * fVar298;
      auVar37._20_4_ = fVar253 * fVar299;
      auVar37._24_4_ = fVar254 * fVar300;
      auVar37._28_4_ = auVar13._28_4_;
      auVar96 = vfnmsub231ps_fma(auVar37,local_a60,_local_a80);
      auVar262 = ZEXT3264(local_a00);
      auVar89 = vfnmadd231ps_fma(ZEXT1632(auVar96),auVar19,auVar288);
      auVar13 = vandps_avx(auVar68,ZEXT1632(auVar89));
      auVar16 = vrcpps_avx(ZEXT1632(auVar89));
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar107._16_4_ = 0x219392ef;
      auVar107._20_4_ = 0x219392ef;
      auVar107._24_4_ = 0x219392ef;
      auVar107._28_4_ = 0x219392ef;
      auVar163 = vcmpps_avx(auVar13,auVar107,1);
      auVar193 = ZEXT1632(auVar89);
      auVar96 = vfnmadd213ps_fma(auVar16,auVar193,auVar290);
      auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar16,auVar16);
      auVar247._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
      auVar247._8_4_ = auVar89._8_4_ ^ 0x80000000;
      auVar247._12_4_ = auVar89._12_4_ ^ 0x80000000;
      auVar247._16_4_ = 0x80000000;
      auVar247._20_4_ = 0x80000000;
      auVar247._24_4_ = 0x80000000;
      auVar247._28_4_ = 0x80000000;
      auVar248 = ZEXT3264(auVar247);
      auVar38._4_4_ = auVar96._4_4_ * -auVar122._4_4_;
      auVar38._0_4_ = auVar96._0_4_ * -auVar122._0_4_;
      auVar38._8_4_ = auVar96._8_4_ * -auVar122._8_4_;
      auVar38._12_4_ = auVar96._12_4_ * -auVar122._12_4_;
      auVar38._16_4_ = 0x80000000;
      auVar38._20_4_ = 0x80000000;
      auVar38._24_4_ = 0x80000000;
      auVar38._28_4_ = 0x80000000;
      auVar13 = vcmpps_avx(auVar193,auVar247,1);
      auVar13 = vorps_avx(auVar13,auVar163);
      auVar108._8_4_ = 0xff800000;
      auVar108._0_8_ = 0xff800000ff800000;
      auVar108._12_4_ = 0xff800000;
      auVar108._16_4_ = 0xff800000;
      auVar108._20_4_ = 0xff800000;
      auVar108._24_4_ = 0xff800000;
      auVar108._28_4_ = 0xff800000;
      auVar13 = vblendvps_avx(auVar38,auVar108,auVar13);
      auVar276 = ZEXT3264(auVar13);
      _local_9a0 = vmaxps_avx(auVar15,auVar13);
      auVar13 = vcmpps_avx(auVar193,auVar247,6);
      auVar13 = vorps_avx(auVar163,auVar13);
      auVar109._8_4_ = 0x7f800000;
      auVar109._0_8_ = 0x7f8000007f800000;
      auVar109._12_4_ = 0x7f800000;
      auVar109._16_4_ = 0x7f800000;
      auVar109._20_4_ = 0x7f800000;
      auVar109._24_4_ = 0x7f800000;
      auVar109._28_4_ = 0x7f800000;
      auVar13 = vblendvps_avx(auVar38,auVar109,auVar13);
      auVar110 = vandps_avx(local_2c0,auVar110);
      local_380 = vminps_avx(auVar228,auVar13);
      auVar13 = vcmpps_avx(_local_9a0,local_380,2);
      auVar163 = auVar110 & auVar13;
      if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar163 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar163 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar163 >> 0x7f,0) == '\0') &&
            (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar163 >> 0xbf,0) == '\0') &&
          (auVar163 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar163[0x1f]) {
        auVar233 = ZEXT3264(local_980);
      }
      else {
        auVar163 = vminps_avx(local_600,auVar290);
        auVar206 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar163 = vmaxps_avx(auVar163,ZEXT832(0) << 0x20);
        auVar15 = vminps_avx(local_620,auVar290);
        auVar15 = vmaxps_avx(auVar15,ZEXT832(0) << 0x20);
        auVar39._4_4_ = (auVar163._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar163._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar163._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar163._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar163._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar163._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar163._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar163._28_4_ + 7.0;
        auVar96 = vfmadd213ps_fma(auVar39,local_960,local_920);
        auVar40._4_4_ = (auVar15._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar15._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar15._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar15._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar15._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar15._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar15._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar15._28_4_ + 7.0;
        auVar122 = vfmadd213ps_fma(auVar40,local_960,local_920);
        auVar163 = vminps_avx(local_760,local_780);
        auVar15 = vminps_avx(local_7a0,auVar20);
        auVar163 = vminps_avx(auVar163,auVar15);
        auVar102 = vsubps_avx(auVar163,auVar102);
        auVar110 = vandps_avx(auVar13,auVar110);
        local_600 = ZEXT1632(auVar96);
        local_620 = ZEXT1632(auVar122);
        auVar41._4_4_ = auVar102._4_4_ * 0.99999976;
        auVar41._0_4_ = auVar102._0_4_ * 0.99999976;
        auVar41._8_4_ = auVar102._8_4_ * 0.99999976;
        auVar41._12_4_ = auVar102._12_4_ * 0.99999976;
        auVar41._16_4_ = auVar102._16_4_ * 0.99999976;
        auVar41._20_4_ = auVar102._20_4_ * 0.99999976;
        auVar41._24_4_ = auVar102._24_4_ * 0.99999976;
        auVar41._28_4_ = 0x3f7ffffc;
        auVar102 = vmaxps_avx(ZEXT832(0) << 0x20,auVar41);
        auVar42._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar42._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar42._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar42._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar42._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar42._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar42._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar42._28_4_ = auVar102._28_4_;
        auVar13 = vsubps_avx(local_7e0,auVar42);
        auVar276 = ZEXT3264(auVar13);
        auVar43._4_4_ = auVar13._4_4_ * fVar154 * 4.0;
        auVar43._0_4_ = auVar13._0_4_ * fVar152 * 4.0;
        auVar43._8_4_ = auVar13._8_4_ * fVar172 * 4.0;
        auVar43._12_4_ = auVar13._12_4_ * fVar173 * 4.0;
        auVar43._16_4_ = auVar13._16_4_ * fVar174 * 4.0;
        auVar43._20_4_ = auVar13._20_4_ * fVar175 * 4.0;
        auVar43._24_4_ = auVar13._24_4_ * fVar234 * 4.0;
        auVar43._28_4_ = auVar102._28_4_;
        auVar102 = vsubps_avx(auVar30,auVar43);
        local_a20 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,5);
        auVar262 = ZEXT3264(local_a20);
        if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a20 >> 0x7f,0) == '\0') &&
              (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a20 >> 0xbf,0) == '\0') &&
            (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a20[0x1f]) {
          auVar56 = ZEXT412(0);
          auVar161 = ZEXT1232(auVar56) << 0x20;
          local_860 = ZEXT1232(auVar56) << 0x20;
          _local_880 = ZEXT1232(auVar56) << 0x20;
          auVar194 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar230._8_4_ = 0x7f800000;
          auVar230._0_8_ = 0x7f8000007f800000;
          auVar230._12_4_ = 0x7f800000;
          auVar230._16_4_ = 0x7f800000;
          auVar230._20_4_ = 0x7f800000;
          auVar230._24_4_ = 0x7f800000;
          auVar230._28_4_ = 0x7f800000;
          auVar240._8_4_ = 0xff800000;
          auVar240._0_8_ = 0xff800000ff800000;
          auVar240._12_4_ = 0xff800000;
          auVar240._16_4_ = 0xff800000;
          auVar240._20_4_ = 0xff800000;
          auVar240._24_4_ = 0xff800000;
          auVar240._28_4_ = 0xff800000;
          local_a20 = auVar18;
          _local_840 = local_860;
        }
        else {
          auVar162._0_4_ = fVar152 + fVar152;
          auVar162._4_4_ = fVar154 + fVar154;
          auVar162._8_4_ = fVar172 + fVar172;
          auVar162._12_4_ = fVar173 + fVar173;
          auVar162._16_4_ = fVar174 + fVar174;
          auVar162._20_4_ = fVar175 + fVar175;
          auVar162._24_4_ = fVar234 + fVar234;
          auVar162._28_4_ = fVar120 + fVar120;
          auVar163 = vrcpps_avx(auVar162);
          auVar96 = vfnmadd213ps_fma(auVar162,auVar163,auVar290);
          auVar96 = vfmadd132ps_fma(ZEXT1632(auVar96),auVar163,auVar163);
          auVar163 = vsqrtps_avx(auVar102);
          uVar84 = CONCAT44(auVar259._4_4_,auVar259._0_4_);
          auVar208._0_8_ = uVar84 ^ 0x8000000080000000;
          auVar208._8_4_ = -auVar259._8_4_;
          auVar208._12_4_ = -auVar259._12_4_;
          auVar208._16_4_ = -auVar259._16_4_;
          auVar208._20_4_ = -auVar259._20_4_;
          auVar208._24_4_ = -auVar259._24_4_;
          auVar208._28_4_ = -auVar259._28_4_;
          auVar15 = vsubps_avx(auVar208,auVar163);
          auVar163 = vsubps_avx(auVar163,auVar259);
          fVar172 = auVar15._0_4_ * auVar96._0_4_;
          fVar298 = auVar15._4_4_ * auVar96._4_4_;
          auVar44._4_4_ = fVar298;
          auVar44._0_4_ = fVar172;
          fVar299 = auVar15._8_4_ * auVar96._8_4_;
          auVar44._8_4_ = fVar299;
          fVar300 = auVar15._12_4_ * auVar96._12_4_;
          auVar44._12_4_ = fVar300;
          fVar173 = auVar15._16_4_ * 0.0;
          auVar44._16_4_ = fVar173;
          fVar174 = auVar15._20_4_ * 0.0;
          auVar44._20_4_ = fVar174;
          fVar175 = auVar15._24_4_ * 0.0;
          auVar44._24_4_ = fVar175;
          auVar44._28_4_ = local_2c0._28_4_;
          fVar120 = auVar163._0_4_ * auVar96._0_4_;
          fVar292 = auVar163._4_4_ * auVar96._4_4_;
          auVar45._4_4_ = fVar292;
          auVar45._0_4_ = fVar120;
          fVar86 = auVar163._8_4_ * auVar96._8_4_;
          auVar45._8_4_ = fVar86;
          fVar152 = auVar163._12_4_ * auVar96._12_4_;
          auVar45._12_4_ = fVar152;
          fVar293 = auVar163._16_4_ * 0.0;
          auVar45._16_4_ = fVar293;
          fVar154 = auVar163._20_4_ * 0.0;
          auVar45._20_4_ = fVar154;
          fVar294 = auVar163._24_4_ * 0.0;
          auVar45._24_4_ = fVar294;
          auVar45._28_4_ = 0x3f800000;
          auVar96 = vfmadd213ps_fma(auVar270,auVar44,auVar103);
          auVar122 = vfmadd213ps_fma(auVar270,auVar45,auVar103);
          auVar46._28_4_ = auVar15._28_4_;
          auVar46._0_28_ =
               ZEXT1628(CONCAT412(fVar155 * auVar96._12_4_,
                                  CONCAT48(fVar153 * auVar96._8_4_,
                                           CONCAT44(fVar156 * auVar96._4_4_,fVar151 * auVar96._0_4_)
                                          )));
          auVar163 = ZEXT1632(CONCAT412(fVar155 * auVar122._12_4_,
                                        CONCAT48(fVar153 * auVar122._8_4_,
                                                 CONCAT44(fVar156 * auVar122._4_4_,
                                                          fVar151 * auVar122._0_4_))));
          auVar96 = vfmadd213ps_fma(auVar14,auVar46,auVar190);
          auVar122 = vfmadd213ps_fma(auVar14,auVar163,auVar190);
          auVar89 = vfmadd213ps_fma(auVar194,auVar46,auVar100);
          auVar123 = vfmadd213ps_fma(auVar194,auVar163,auVar100);
          auVar176 = vfmadd213ps_fma(auVar46,auVar161,auVar296);
          auVar138 = vfmadd213ps_fma(auVar161,auVar163,auVar296);
          auVar47._4_4_ = fVar298 * fVar85;
          auVar47._0_4_ = fVar172 * fVar85;
          auVar47._8_4_ = fVar299 * fVar85;
          auVar47._12_4_ = fVar300 * fVar85;
          auVar47._16_4_ = fVar173 * fVar85;
          auVar47._20_4_ = fVar174 * fVar85;
          auVar47._24_4_ = fVar175 * fVar85;
          auVar47._28_4_ = 0;
          auVar161 = vsubps_avx(auVar47,ZEXT1632(auVar96));
          auVar195._0_4_ = fVar172 * (float)local_a80._0_4_;
          auVar195._4_4_ = fVar298 * (float)local_a80._4_4_;
          auVar195._8_4_ = fVar299 * fStack_a78;
          auVar195._12_4_ = fVar300 * fStack_a74;
          auVar195._16_4_ = fVar173 * fStack_a70;
          auVar195._20_4_ = fVar174 * fStack_a6c;
          auVar195._24_4_ = fVar175 * fStack_a68;
          auVar195._28_4_ = 0;
          auVar194 = vsubps_avx(auVar195,ZEXT1632(auVar89));
          auVar231._0_4_ = fVar242 * fVar172;
          auVar231._4_4_ = fVar249 * fVar298;
          auVar231._8_4_ = fVar250 * fVar299;
          auVar231._12_4_ = fVar251 * fVar300;
          auVar231._16_4_ = fVar252 * fVar173;
          auVar231._20_4_ = fVar253 * fVar174;
          auVar231._24_4_ = fVar254 * fVar175;
          auVar231._28_4_ = 0;
          auVar14 = vsubps_avx(auVar231,ZEXT1632(auVar176));
          auVar206 = auVar14._0_28_;
          auVar48._4_4_ = fVar292 * fVar85;
          auVar48._0_4_ = fVar120 * fVar85;
          auVar48._8_4_ = fVar86 * fVar85;
          auVar48._12_4_ = fVar152 * fVar85;
          auVar48._16_4_ = fVar293 * fVar85;
          auVar48._20_4_ = fVar154 * fVar85;
          auVar48._24_4_ = fVar294 * fVar85;
          auVar48._28_4_ = 0;
          _local_840 = vsubps_avx(auVar48,ZEXT1632(auVar122));
          auVar49._4_4_ = fVar292 * (float)local_a80._4_4_;
          auVar49._0_4_ = fVar120 * (float)local_a80._0_4_;
          auVar49._8_4_ = fVar86 * fStack_a78;
          auVar49._12_4_ = fVar152 * fStack_a74;
          auVar49._16_4_ = fVar293 * fStack_a70;
          auVar49._20_4_ = fVar154 * fStack_a6c;
          auVar49._24_4_ = fVar294 * fStack_a68;
          auVar49._28_4_ = local_840._28_4_;
          local_860 = vsubps_avx(auVar49,ZEXT1632(auVar123));
          auVar50._4_4_ = fVar249 * fVar292;
          auVar50._0_4_ = fVar242 * fVar120;
          auVar50._8_4_ = fVar250 * fVar86;
          auVar50._12_4_ = fVar251 * fVar152;
          auVar50._16_4_ = fVar252 * fVar293;
          auVar50._20_4_ = fVar253 * fVar154;
          auVar50._24_4_ = fVar254 * fVar294;
          auVar50._28_4_ = local_860._28_4_;
          _local_880 = vsubps_avx(auVar50,ZEXT1632(auVar138));
          auVar14 = vcmpps_avx(auVar102,_DAT_02020f00,5);
          auVar232._8_4_ = 0x7f800000;
          auVar232._0_8_ = 0x7f8000007f800000;
          auVar232._12_4_ = 0x7f800000;
          auVar232._16_4_ = 0x7f800000;
          auVar232._20_4_ = 0x7f800000;
          auVar232._24_4_ = 0x7f800000;
          auVar232._28_4_ = 0x7f800000;
          auVar230 = vblendvps_avx(auVar232,auVar44,auVar14);
          auVar69._4_4_ = uStack_81c;
          auVar69._0_4_ = local_820;
          auVar69._8_4_ = uStack_818;
          auVar69._12_4_ = uStack_814;
          auVar69._16_4_ = uStack_810;
          auVar69._20_4_ = uStack_80c;
          auVar69._24_4_ = uStack_808;
          auVar69._28_4_ = uStack_804;
          auVar102 = vandps_avx(auVar69,auVar29);
          auVar102 = vmaxps_avx(local_560,auVar102);
          auVar51._4_4_ = auVar102._4_4_ * 1.9073486e-06;
          auVar51._0_4_ = auVar102._0_4_ * 1.9073486e-06;
          auVar51._8_4_ = auVar102._8_4_ * 1.9073486e-06;
          auVar51._12_4_ = auVar102._12_4_ * 1.9073486e-06;
          auVar51._16_4_ = auVar102._16_4_ * 1.9073486e-06;
          auVar51._20_4_ = auVar102._20_4_ * 1.9073486e-06;
          auVar51._24_4_ = auVar102._24_4_ * 1.9073486e-06;
          auVar51._28_4_ = auVar102._28_4_;
          auVar17 = vandps_avx(auVar69,auVar17);
          auVar17 = vcmpps_avx(auVar17,auVar51,1);
          auVar266 = ZEXT3264(auVar17);
          auVar241._8_4_ = 0xff800000;
          auVar241._0_8_ = 0xff800000ff800000;
          auVar241._12_4_ = 0xff800000;
          auVar241._16_4_ = 0xff800000;
          auVar241._20_4_ = 0xff800000;
          auVar241._24_4_ = 0xff800000;
          auVar241._28_4_ = 0xff800000;
          auVar240 = vblendvps_avx(auVar241,auVar45,auVar14);
          auVar102 = auVar14 & auVar17;
          if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar102 >> 0x7f,0) == '\0') &&
                (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0xbf,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar102[0x1f]) {
            auVar262 = ZEXT3264(local_a20);
          }
          else {
            auVar17 = vandps_avx(auVar17,auVar14);
            auVar13 = vcmpps_avx(auVar13,_DAT_02020f00,2);
            auVar283._8_4_ = 0xff800000;
            auVar283._0_8_ = 0xff800000ff800000;
            auVar283._12_4_ = 0xff800000;
            auVar283._16_4_ = 0xff800000;
            auVar283._20_4_ = 0xff800000;
            auVar283._24_4_ = 0xff800000;
            auVar283._28_4_ = 0xff800000;
            auVar284._8_4_ = 0x7f800000;
            auVar284._0_8_ = 0x7f8000007f800000;
            auVar284._12_4_ = 0x7f800000;
            auVar284._16_4_ = 0x7f800000;
            auVar284._20_4_ = 0x7f800000;
            auVar284._24_4_ = 0x7f800000;
            auVar284._28_4_ = 0x7f800000;
            auVar102 = vblendvps_avx(auVar284,auVar283,auVar13);
            auVar96 = vpackssdw_avx(auVar17._0_16_,auVar17._16_16_);
            auVar163 = vpmovsxwd_avx2(auVar96);
            auVar266 = ZEXT3264(auVar163);
            auVar230 = vblendvps_avx(auVar230,auVar102,auVar163);
            auVar102 = vblendvps_avx(auVar283,auVar284,auVar13);
            auVar276 = ZEXT3264(auVar102);
            auVar240 = vblendvps_avx(auVar240,auVar102,auVar163);
            auVar261._0_8_ = auVar17._0_8_ ^ 0xffffffffffffffff;
            auVar261._8_4_ = auVar17._8_4_ ^ 0xffffffff;
            auVar261._12_4_ = auVar17._12_4_ ^ 0xffffffff;
            auVar261._16_4_ = auVar17._16_4_ ^ 0xffffffff;
            auVar261._20_4_ = auVar17._20_4_ ^ 0xffffffff;
            auVar261._24_4_ = auVar17._24_4_ ^ 0xffffffff;
            auVar261._28_4_ = auVar17._28_4_ ^ 0xffffffff;
            auVar17 = vorps_avx(auVar13,auVar261);
            auVar17 = vandps_avx(auVar17,auVar14);
            auVar262 = ZEXT3264(auVar17);
          }
        }
        local_500 = _local_9a0;
        local_4e0 = vminps_avx(local_380,auVar230);
        _local_6a0 = vmaxps_avx(_local_9a0,auVar240);
        _local_3a0 = _local_6a0;
        auVar17 = vcmpps_avx(_local_9a0,local_4e0,2);
        local_660 = vandps_avx(auVar17,auVar110);
        auVar17 = vcmpps_avx(_local_6a0,local_380,2);
        local_700 = vandps_avx(auVar17,auVar110);
        auVar110 = vorps_avx(local_700,local_660);
        auVar248 = ZEXT3264(local_aa0);
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) {
          auVar233 = ZEXT3264(local_980);
        }
        else {
          local_340._0_8_ = auVar262._0_8_ ^ 0xffffffffffffffff;
          local_340._8_4_ = auVar262._8_4_ ^ 0xffffffff;
          local_340._12_4_ = auVar262._12_4_ ^ 0xffffffff;
          local_340._16_4_ = auVar262._16_4_ ^ 0xffffffff;
          local_340._20_4_ = auVar262._20_4_ ^ 0xffffffff;
          local_340._24_4_ = auVar262._24_4_ ^ 0xffffffff;
          local_340._28_4_ = auVar262._28_4_ ^ 0xffffffff;
          auVar52._4_4_ = fVar249 * auVar206._4_4_;
          auVar52._0_4_ = fVar242 * auVar206._0_4_;
          auVar52._8_4_ = fVar250 * auVar206._8_4_;
          auVar52._12_4_ = fVar251 * auVar206._12_4_;
          auVar52._16_4_ = fVar252 * auVar206._16_4_;
          auVar52._20_4_ = fVar253 * auVar206._20_4_;
          auVar52._24_4_ = fVar254 * auVar206._24_4_;
          auVar52._28_4_ = auVar110._28_4_;
          auVar96 = vfmadd213ps_fma(auVar194,_local_a80,auVar52);
          auVar96 = vfmadd213ps_fma(auVar161,auVar288,ZEXT1632(auVar96));
          auVar70._4_4_ = uStack_81c;
          auVar70._0_4_ = local_820;
          auVar70._8_4_ = uStack_818;
          auVar70._12_4_ = uStack_814;
          auVar70._16_4_ = uStack_810;
          auVar70._20_4_ = uStack_80c;
          auVar70._24_4_ = uStack_808;
          auVar70._28_4_ = uStack_804;
          auVar110 = vandps_avx(ZEXT1632(auVar96),auVar70);
          auVar142._8_4_ = 0x3e99999a;
          auVar142._0_8_ = 0x3e99999a3e99999a;
          auVar142._12_4_ = 0x3e99999a;
          auVar142._16_4_ = 0x3e99999a;
          auVar142._20_4_ = 0x3e99999a;
          auVar142._24_4_ = 0x3e99999a;
          auVar142._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar142,1);
          auVar110 = vorps_avx(auVar110,local_340);
          auVar143._8_4_ = 3;
          auVar143._0_8_ = 0x300000003;
          auVar143._12_4_ = 3;
          auVar143._16_4_ = 3;
          auVar143._20_4_ = 3;
          auVar143._24_4_ = 3;
          auVar143._28_4_ = 3;
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar164,auVar143,auVar110);
          uVar83 = (undefined4)local_720;
          local_360._4_4_ = uVar83;
          local_360._0_4_ = uVar83;
          local_360._8_4_ = uVar83;
          local_360._12_4_ = uVar83;
          local_360._16_4_ = uVar83;
          local_360._20_4_ = uVar83;
          local_360._24_4_ = uVar83;
          local_360._28_4_ = uVar83;
          local_680 = vpcmpgtd_avx2(auVar110,local_360);
          local_6e0 = vpandn_avx2(local_680,local_660);
          auVar233 = ZEXT3264(local_6e0);
          auVar110 = local_660 & ~local_680;
          auStack_718 = auVar30._8_24_;
          fStack_b3c = auVar90._4_4_;
          fStack_b38 = auVar90._8_4_;
          fStack_b34 = auVar90._12_4_;
          uVar84 = local_720;
          local_6c0 = local_700;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar110 >> 0x7f,0) != '\0') ||
                (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar110 >> 0xbf,0) != '\0') ||
              (auVar110 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar110[0x1f] < '\0') {
            auVar122 = vminps_avx(auVar9,auVar91);
            auVar96 = vmaxps_avx(auVar9,auVar91);
            auVar89 = vminps_avx(auVar10,auVar90);
            auVar123 = vminps_avx(auVar122,auVar89);
            auVar122 = vmaxps_avx(auVar10,auVar90);
            auVar89 = vmaxps_avx(auVar96,auVar122);
            auVar96 = vandps_avx(auVar123,local_9c0);
            auVar122 = vandps_avx(auVar89,local_9c0);
            auVar96 = vmaxps_avx(auVar96,auVar122);
            auVar122 = vmovshdup_avx(auVar96);
            auVar122 = vmaxss_avx(auVar122,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar122);
            local_a20._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar89,auVar89,0xff);
            local_800._4_4_ = (float)local_9a0._4_4_ + (float)local_940._4_4_;
            local_800._0_4_ = (float)local_9a0._0_4_ + (float)local_940._0_4_;
            fStack_7f8 = fStack_998 + fStack_938;
            fStack_7f4 = fStack_994 + fStack_934;
            fStack_7f0 = fStack_990 + fStack_930;
            fStack_7ec = fStack_98c + fStack_92c;
            fStack_7e8 = fStack_988 + fStack_928;
            fStack_7e4 = fStack_984 + fStack_924;
            do {
              auVar144._8_4_ = 0x7f800000;
              auVar144._0_8_ = 0x7f8000007f800000;
              auVar144._12_4_ = 0x7f800000;
              auVar144._16_4_ = 0x7f800000;
              auVar144._20_4_ = 0x7f800000;
              auVar144._24_4_ = 0x7f800000;
              auVar144._28_4_ = 0x7f800000;
              auVar110 = auVar233._0_32_;
              auVar17 = vblendvps_avx(auVar144,_local_9a0,auVar110);
              auVar102 = vshufps_avx(auVar17,auVar17,0xb1);
              auVar102 = vminps_avx(auVar17,auVar102);
              auVar13 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar13);
              auVar13 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar13);
              auVar17 = vcmpps_avx(auVar17,auVar102,0);
              auVar102 = auVar110 & auVar17;
              if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar102 >> 0x7f,0) != '\0') ||
                    (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar102 >> 0xbf,0) != '\0') ||
                  (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar102[0x1f] < '\0') {
                auVar110 = vandps_avx(auVar17,auVar110);
              }
              local_7e0._0_8_ = uVar80;
              uVar78 = vmovmskps_avx(auVar110);
              iVar77 = 0;
              for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar77 = iVar77 + 1;
              }
              uVar78 = iVar77 << 2;
              *(undefined4 *)(local_6e0 + uVar78) = 0;
              fVar120 = *(float *)(local_600 + uVar78);
              fVar292 = *(float *)(local_500 + uVar78);
              fVar151 = auVar5._0_4_;
              if ((float)local_9d0._0_4_ < 0.0) {
                fVar151 = sqrtf((float)local_9d0._0_4_);
              }
              local_960._0_4_ = fVar151 * 1.9073486e-06;
              lVar81 = 5;
              do {
                fVar151 = 1.0 - fVar120;
                auVar124._0_4_ = fVar119 * fVar120;
                auVar124._4_4_ = auVar91._4_4_ * fVar120;
                auVar124._8_4_ = auVar91._8_4_ * fVar120;
                auVar124._12_4_ = auVar91._12_4_ * fVar120;
                auVar157._4_4_ = fVar151;
                auVar157._0_4_ = fVar151;
                auVar157._8_4_ = fVar151;
                auVar157._12_4_ = fVar151;
                auVar96 = vfmadd231ps_fma(auVar124,auVar157,auVar9);
                auVar177._0_4_ = fVar198 * fVar120;
                auVar177._4_4_ = auVar10._4_4_ * fVar120;
                auVar177._8_4_ = auVar10._8_4_ * fVar120;
                auVar177._12_4_ = auVar10._12_4_ * fVar120;
                auVar122 = vfmadd231ps_fma(auVar177,auVar157,auVar91);
                auVar221._0_4_ = fVar120 * auVar122._0_4_;
                auVar221._4_4_ = fVar120 * auVar122._4_4_;
                auVar221._8_4_ = fVar120 * auVar122._8_4_;
                auVar221._12_4_ = fVar120 * auVar122._12_4_;
                auVar89 = vfmadd231ps_fma(auVar221,auVar157,auVar96);
                auVar125._0_4_ = fVar120 * fVar118;
                auVar125._4_4_ = fVar120 * fStack_b3c;
                auVar125._8_4_ = fVar120 * fStack_b38;
                auVar125._12_4_ = fVar120 * fStack_b34;
                auVar96 = vfmadd231ps_fma(auVar125,auVar157,auVar10);
                auVar202._0_4_ = fVar120 * auVar96._0_4_;
                auVar202._4_4_ = fVar120 * auVar96._4_4_;
                auVar202._8_4_ = fVar120 * auVar96._8_4_;
                auVar202._12_4_ = fVar120 * auVar96._12_4_;
                auVar122 = vfmadd231ps_fma(auVar202,auVar157,auVar122);
                auVar126._4_4_ = fVar292;
                auVar126._0_4_ = fVar292;
                auVar126._8_4_ = fVar292;
                auVar126._12_4_ = fVar292;
                auVar96 = vfmadd213ps_fma(auVar126,local_9b0,_DAT_01feba10);
                auVar92._0_4_ = fVar120 * auVar122._0_4_;
                auVar92._4_4_ = fVar120 * auVar122._4_4_;
                auVar92._8_4_ = fVar120 * auVar122._8_4_;
                auVar92._12_4_ = fVar120 * auVar122._12_4_;
                auVar123 = vfmadd231ps_fma(auVar92,auVar89,auVar157);
                local_740._0_16_ = auVar123;
                auVar96 = vsubps_avx(auVar96,auVar123);
                _local_900 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_a00._0_16_ = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  auVar233._0_4_ = sqrtf(auVar96._0_4_);
                  auVar233._4_60_ = extraout_var;
                  auVar96 = auVar233._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                }
                auVar122 = vsubps_avx(auVar122,auVar89);
                auVar236._0_4_ = auVar122._0_4_ * 3.0;
                auVar236._4_4_ = auVar122._4_4_ * 3.0;
                auVar236._8_4_ = auVar122._8_4_ * 3.0;
                auVar236._12_4_ = auVar122._12_4_ * 3.0;
                auVar122 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar151),
                                           ZEXT416((uint)fVar120));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar120),
                                          ZEXT416((uint)fVar151));
                fVar151 = fVar151 * 6.0;
                fVar86 = auVar122._0_4_ * 6.0;
                fVar156 = auVar89._0_4_ * 6.0;
                fVar152 = fVar120 * 6.0;
                auVar178._0_4_ = fVar152 * fVar118;
                auVar178._4_4_ = fVar152 * fStack_b3c;
                auVar178._8_4_ = fVar152 * fStack_b38;
                auVar178._12_4_ = fVar152 * fStack_b34;
                auVar127._4_4_ = fVar156;
                auVar127._0_4_ = fVar156;
                auVar127._8_4_ = fVar156;
                auVar127._12_4_ = fVar156;
                auVar122 = vfmadd132ps_fma(auVar127,auVar178,auVar10);
                auVar179._4_4_ = fVar86;
                auVar179._0_4_ = fVar86;
                auVar179._8_4_ = fVar86;
                auVar179._12_4_ = fVar86;
                auVar122 = vfmadd132ps_fma(auVar179,auVar122,auVar91);
                auVar89 = vdpps_avx(auVar236,auVar236,0x7f);
                auVar128._4_4_ = fVar151;
                auVar128._0_4_ = fVar151;
                auVar128._8_4_ = fVar151;
                auVar128._12_4_ = fVar151;
                auVar176 = vfmadd132ps_fma(auVar128,auVar122,auVar9);
                auVar122 = vblendps_avx(auVar89,_DAT_01feba10,0xe);
                auVar123 = vrsqrtss_avx(auVar122,auVar122);
                fVar156 = auVar89._0_4_;
                fVar151 = auVar123._0_4_;
                auVar123 = vdpps_avx(auVar236,auVar176,0x7f);
                fVar151 = fVar151 * 1.5 + fVar156 * -0.5 * fVar151 * fVar151 * fVar151;
                auVar129._0_4_ = auVar176._0_4_ * fVar156;
                auVar129._4_4_ = auVar176._4_4_ * fVar156;
                auVar129._8_4_ = auVar176._8_4_ * fVar156;
                auVar129._12_4_ = auVar176._12_4_ * fVar156;
                fVar86 = auVar123._0_4_;
                auVar222._0_4_ = auVar236._0_4_ * fVar86;
                auVar222._4_4_ = auVar236._4_4_ * fVar86;
                auVar222._8_4_ = auVar236._8_4_ * fVar86;
                auVar222._12_4_ = auVar236._12_4_ * fVar86;
                auVar123 = vsubps_avx(auVar129,auVar222);
                auVar122 = vrcpss_avx(auVar122,auVar122);
                auVar176 = vfnmadd213ss_fma(auVar122,auVar89,ZEXT416(0x40000000));
                fVar86 = auVar122._0_4_ * auVar176._0_4_;
                auVar122 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(fVar292 * (float)local_960._0_4_)));
                uVar80 = CONCAT44(auVar236._4_4_,auVar236._0_4_);
                auVar257._0_8_ = uVar80 ^ 0x8000000080000000;
                auVar257._8_4_ = -auVar236._8_4_;
                auVar257._12_4_ = -auVar236._12_4_;
                local_920._0_4_ = fVar151 * auVar123._0_4_ * fVar86;
                local_920._4_4_ = fVar151 * auVar123._4_4_ * fVar86;
                local_920._8_4_ = fVar151 * auVar123._8_4_ * fVar86;
                local_920._12_4_ = fVar151 * auVar123._12_4_ * fVar86;
                local_a60._0_4_ = auVar236._0_4_ * fVar151;
                local_a60._4_4_ = auVar236._4_4_ * fVar151;
                local_a60._8_4_ = auVar236._8_4_ * fVar151;
                local_a60._12_4_ = auVar236._12_4_ * fVar151;
                if (fVar156 < -fVar156) {
                  local_a40._0_16_ = auVar257;
                  fVar151 = sqrtf(fVar156);
                  auVar96 = ZEXT416(auVar96._0_4_);
                  auVar257 = local_a40._0_16_;
                  auVar89 = local_a60._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar151 = auVar89._0_4_;
                  auVar89 = local_a60._0_16_;
                }
                auVar266 = ZEXT1664(auVar89);
                auVar123 = vdpps_avx(_local_900,auVar89,0x7f);
                auVar121 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar96,
                                           ZEXT416((uint)auVar122._0_4_));
                auVar176 = vdpps_avx(auVar257,auVar89,0x7f);
                auVar138 = vdpps_avx(_local_900,local_920._0_16_,0x7f);
                auVar88 = vdpps_avx(local_9b0,auVar89,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_a20._0_4_ / fVar151)),auVar121
                                         );
                local_a40._0_4_ = auVar96._0_4_;
                auVar93._0_4_ = auVar123._0_4_ * auVar123._0_4_;
                auVar93._4_4_ = auVar123._4_4_ * auVar123._4_4_;
                auVar93._8_4_ = auVar123._8_4_ * auVar123._8_4_;
                auVar93._12_4_ = auVar123._12_4_ * auVar123._12_4_;
                auVar96 = vdpps_avx(_local_900,auVar257,0x7f);
                auVar200 = vsubps_avx(local_a00._0_16_,auVar93);
                auVar121 = vrsqrtss_avx(auVar200,auVar200);
                fVar86 = auVar200._0_4_;
                fVar151 = auVar121._0_4_;
                fVar151 = fVar151 * 1.5 + fVar86 * -0.5 * fVar151 * fVar151 * fVar151;
                auVar121 = vdpps_avx(_local_900,local_9b0,0x7f);
                local_a60._0_16_ = ZEXT416((uint)(auVar176._0_4_ + auVar138._0_4_));
                local_920._0_16_ = vfnmadd231ss_fma(auVar96,auVar123,local_a60._0_16_);
                auVar262 = ZEXT1664(local_920._0_16_);
                auVar96 = vfnmadd231ss_fma(auVar121,auVar123,auVar88);
                if (fVar86 < 0.0) {
                  local_760._0_16_ = auVar88;
                  local_780._0_4_ = fVar151;
                  local_7a0._0_16_ = auVar96;
                  auVar262 = ZEXT1664(local_920._0_16_);
                  auVar266 = ZEXT1664(auVar89);
                  fVar86 = sqrtf(fVar86);
                  fVar151 = (float)local_780._0_4_;
                  auVar96 = local_7a0._0_16_;
                  auVar88 = local_760._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar200,auVar200);
                  fVar86 = auVar89._0_4_;
                }
                auVar89 = vpermilps_avx(local_740._0_16_,0xff);
                auVar138 = vpermilps_avx(auVar236,0xff);
                auVar176 = vfmsub213ss_fma(local_920._0_16_,ZEXT416((uint)fVar151),auVar138);
                auVar180._0_8_ = auVar88._0_8_ ^ 0x8000000080000000;
                auVar180._8_4_ = auVar88._8_4_ ^ 0x80000000;
                auVar180._12_4_ = auVar88._12_4_ ^ 0x80000000;
                auVar203._0_8_ = auVar176._0_8_ ^ 0x8000000080000000;
                auVar203._8_4_ = auVar176._8_4_ ^ 0x80000000;
                auVar203._12_4_ = auVar176._12_4_ ^ 0x80000000;
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * fVar151));
                auVar176 = vfmsub231ss_fma(ZEXT416((uint)(auVar88._0_4_ * auVar176._0_4_)),
                                           local_a60._0_16_,auVar96);
                auVar96 = vinsertps_avx(auVar96,auVar180,0x10);
                uVar83 = auVar176._0_4_;
                auVar181._4_4_ = uVar83;
                auVar181._0_4_ = uVar83;
                auVar181._8_4_ = uVar83;
                auVar181._12_4_ = uVar83;
                auVar96 = vdivps_avx(auVar96,auVar181);
                auVar88 = ZEXT416((uint)(fVar86 - auVar89._0_4_));
                auVar176 = vinsertps_avx(auVar123,auVar88,0x10);
                auVar158._0_4_ = auVar176._0_4_ * auVar96._0_4_;
                auVar158._4_4_ = auVar176._4_4_ * auVar96._4_4_;
                auVar158._8_4_ = auVar176._8_4_ * auVar96._8_4_;
                auVar158._12_4_ = auVar176._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar203,local_a60._0_16_,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar181);
                auVar89 = vhaddps_avx(auVar158,auVar158);
                auVar182._0_4_ = auVar176._0_4_ * auVar96._0_4_;
                auVar182._4_4_ = auVar176._4_4_ * auVar96._4_4_;
                auVar182._8_4_ = auVar176._8_4_ * auVar96._8_4_;
                auVar182._12_4_ = auVar176._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar182,auVar182);
                fVar120 = fVar120 - auVar89._0_4_;
                fVar292 = fVar292 - auVar96._0_4_;
                auVar96 = vandps_avx(auVar123,local_9c0);
                bVar53 = true;
                if ((float)local_a40._0_4_ <= auVar96._0_4_) {
LAB_01696a42:
                  auVar248 = ZEXT3264(local_aa0);
                }
                else {
                  auVar122 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ + auVar122._0_4_)
                                                    ),local_7c0,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar88,local_9c0);
                  if (auVar122._0_4_ <= auVar96._0_4_) goto LAB_01696a42;
                  fVar292 = fVar292 + (float)local_8b0._0_4_;
                  if ((fVar292 < fVar117) ||
                     (fVar151 = *(float *)(ray + k * 4 + 0x100), fVar151 < fVar292)) {
                    bVar53 = false;
                    unaff_BL = 0;
                    goto LAB_01696a42;
                  }
                  bVar53 = false;
                  auVar248 = ZEXT3264(local_aa0);
                  if ((fVar120 < 0.0) || (1.0 < fVar120)) {
                    unaff_BL = 0;
                  }
                  else {
                    auVar96 = vrsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                    fVar86 = auVar96._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar76].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      unaff_BL = 0;
                    }
                    else {
                      if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                         (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar86 = fVar86 * 1.5 + local_a00._0_4_ * -0.5 * fVar86 * fVar86 * fVar86;
                        auVar130._0_4_ = fVar86 * (float)local_900._0_4_;
                        auVar130._4_4_ = fVar86 * (float)local_900._4_4_;
                        auVar130._8_4_ = fVar86 * fStack_8f8;
                        auVar130._12_4_ = fVar86 * fStack_8f4;
                        auVar123 = vfmadd213ps_fma(auVar138,auVar130,auVar236);
                        auVar96 = vshufps_avx(auVar130,auVar130,0xc9);
                        auVar122 = vshufps_avx(auVar236,auVar236,0xc9);
                        auVar131._0_4_ = auVar130._0_4_ * auVar122._0_4_;
                        auVar131._4_4_ = auVar130._4_4_ * auVar122._4_4_;
                        auVar131._8_4_ = auVar130._8_4_ * auVar122._8_4_;
                        auVar131._12_4_ = auVar130._12_4_ * auVar122._12_4_;
                        auVar89 = vfmsub231ps_fma(auVar131,auVar236,auVar96);
                        auVar96 = vshufps_avx(auVar89,auVar89,0xc9);
                        auVar122 = vshufps_avx(auVar123,auVar123,0xc9);
                        auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                        auVar94._0_4_ = auVar123._0_4_ * auVar89._0_4_;
                        auVar94._4_4_ = auVar123._4_4_ * auVar89._4_4_;
                        auVar94._8_4_ = auVar123._8_4_ * auVar89._8_4_;
                        auVar94._12_4_ = auVar123._12_4_ * auVar89._12_4_;
                        auVar122 = vfmsub231ps_fma(auVar94,auVar96,auVar122);
                        auVar96 = vmovshdup_avx(auVar122);
                        auVar165._0_8_ = auVar96._0_8_;
                        auVar165._8_8_ = auVar165._0_8_;
                        auVar165._16_8_ = auVar165._0_8_;
                        auVar165._24_8_ = auVar165._0_8_;
                        auVar96 = vshufps_avx(auVar122,auVar122,0xaa);
                        local_4a0 = auVar96._0_8_;
                        local_480 = auVar122._0_4_;
                        local_4c0[0] = (RTCHitN)(char)auVar165._0_8_;
                        local_4c0[1] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 8);
                        local_4c0[2] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x10);
                        local_4c0[3] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x18);
                        local_4c0[4] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x20);
                        local_4c0[5] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x28);
                        local_4c0[6] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x30);
                        local_4c0[7] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x38);
                        local_4c0[8] = (RTCHitN)(char)auVar165._0_8_;
                        local_4c0[9] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 8);
                        local_4c0[10] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x10);
                        local_4c0[0xb] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x18);
                        local_4c0[0xc] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x20);
                        local_4c0[0xd] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x28);
                        local_4c0[0xe] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x30);
                        local_4c0[0xf] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x38);
                        local_4c0[0x10] = (RTCHitN)(char)auVar165._0_8_;
                        local_4c0[0x11] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 8);
                        local_4c0[0x12] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x10);
                        local_4c0[0x13] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x18);
                        local_4c0[0x14] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x20);
                        local_4c0[0x15] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x28);
                        local_4c0[0x16] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x30);
                        local_4c0[0x17] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x38);
                        local_4c0[0x18] = (RTCHitN)(char)auVar165._0_8_;
                        local_4c0[0x19] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 8);
                        local_4c0[0x1a] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x10);
                        local_4c0[0x1b] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x18);
                        local_4c0[0x1c] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x20);
                        local_4c0[0x1d] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x28);
                        local_4c0[0x1e] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x30);
                        local_4c0[0x1f] = (RTCHitN)(char)((ulong)auVar165._0_8_ >> 0x38);
                        uStack_498 = local_4a0;
                        uStack_490 = local_4a0;
                        uStack_488 = local_4a0;
                        uStack_47c = local_480;
                        uStack_478 = local_480;
                        uStack_474 = local_480;
                        uStack_470 = local_480;
                        uStack_46c = local_480;
                        uStack_468 = local_480;
                        uStack_464 = local_480;
                        local_460 = fVar120;
                        fStack_45c = fVar120;
                        fStack_458 = fVar120;
                        fStack_454 = fVar120;
                        fStack_450 = fVar120;
                        fStack_44c = fVar120;
                        fStack_448 = fVar120;
                        fStack_444 = fVar120;
                        local_440 = ZEXT432(0) << 0x20;
                        local_420 = CONCAT44(uStack_59c,local_5a0);
                        uStack_418 = CONCAT44(uStack_594,uStack_598);
                        uStack_410 = CONCAT44(uStack_58c,uStack_590);
                        uStack_408 = CONCAT44(uStack_584,uStack_588);
                        local_400 = CONCAT44(uStack_57c,local_580);
                        uStack_3f8 = CONCAT44(uStack_574,uStack_578);
                        uStack_3f0 = CONCAT44(uStack_56c,uStack_570);
                        uStack_3e8 = CONCAT44(uStack_564,uStack_568);
                        auVar110 = vpcmpeqd_avx2(auVar165,auVar165);
                        local_3e0 = context->user->instID[0];
                        uStack_3dc = local_3e0;
                        uStack_3d8 = local_3e0;
                        uStack_3d4 = local_3e0;
                        uStack_3d0 = local_3e0;
                        uStack_3cc = local_3e0;
                        uStack_3c8 = local_3e0;
                        uStack_3c4 = local_3e0;
                        local_3c0 = context->user->instPrimID[0];
                        uStack_3bc = local_3c0;
                        uStack_3b8 = local_3c0;
                        uStack_3b4 = local_3c0;
                        uStack_3b0 = local_3c0;
                        uStack_3ac = local_3c0;
                        uStack_3a8 = local_3c0;
                        uStack_3a4 = local_3c0;
                        *(float *)(ray + k * 4 + 0x100) = fVar292;
                        local_8e0 = local_5c0._0_8_;
                        uStack_8d8 = local_5c0._8_8_;
                        uStack_8d0 = local_5c0._16_8_;
                        uStack_8c8 = local_5c0._24_8_;
                        local_ad0.valid = (int *)&local_8e0;
                        local_ad0.geometryUserPtr = pGVar2->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_4c0;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar110 = ZEXT1632(auVar110._0_16_);
                          auVar262 = ZEXT1664(auVar262._0_16_);
                          auVar266 = ZEXT1664(auVar266._0_16_);
                          (*pGVar2->occlusionFilterN)(&local_ad0);
                          auVar248 = ZEXT3264(local_aa0);
                          auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                        }
                        auVar63._8_8_ = uStack_8d8;
                        auVar63._0_8_ = local_8e0;
                        auVar63._16_8_ = uStack_8d0;
                        auVar63._24_8_ = uStack_8c8;
                        auVar102 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar63)
                        ;
                        auVar17 = auVar110 & ~auVar102;
                        if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar17 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar17 >> 0x7f,0) == '\0') &&
                              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar17 >> 0xbf,0) == '\0') &&
                            (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar17[0x1f]) {
                          auVar102 = auVar102 ^ auVar110;
                        }
                        else {
                          p_Var3 = context->args->filter;
                          if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar110 = ZEXT1632(auVar110._0_16_);
                            auVar262 = ZEXT1664(auVar262._0_16_);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            (*p_Var3)(&local_ad0);
                            auVar248 = ZEXT3264(local_aa0);
                            auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                          }
                          auVar64._8_8_ = uStack_8d8;
                          auVar64._0_8_ = local_8e0;
                          auVar64._16_8_ = uStack_8d0;
                          auVar64._24_8_ = uStack_8c8;
                          auVar17 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar64
                                                 );
                          auVar102 = auVar17 ^ auVar110;
                          auVar166._8_4_ = 0xff800000;
                          auVar166._0_8_ = 0xff800000ff800000;
                          auVar166._12_4_ = 0xff800000;
                          auVar166._16_4_ = 0xff800000;
                          auVar166._20_4_ = 0xff800000;
                          auVar166._24_4_ = 0xff800000;
                          auVar166._28_4_ = 0xff800000;
                          auVar110 = vblendvps_avx(auVar166,*(undefined1 (*) [32])
                                                             (local_ad0.ray + 0x100),auVar17);
                          *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar110;
                        }
                        bVar61 = (auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar62 = (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar60 = (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                        ;
                        bVar59 = SUB321(auVar102 >> 0x7f,0) != '\0';
                        bVar58 = (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar57 = SUB321(auVar102 >> 0xbf,0) != '\0';
                        bVar55 = (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                        ;
                        bVar53 = auVar102[0x1f] < '\0';
                        unaff_BL = ((((((bVar61 || bVar62) || bVar60) || bVar59) || bVar58) ||
                                    bVar57) || bVar55) || bVar53;
                        if (((((((!bVar61 && !bVar62) && !bVar60) && !bVar59) && !bVar58) && !bVar57
                             ) && !bVar55) && !bVar53) {
                          *(float *)(ray + k * 4 + 0x100) = fVar151;
                        }
                        bVar53 = false;
                        goto LAB_01696a46;
                      }
                      unaff_BL = 1;
                    }
                    bVar53 = false;
                  }
                }
LAB_01696a46:
                auVar276 = ZEXT3264(auVar269);
                if (!bVar53) goto LAB_01696db7;
                lVar81 = lVar81 + -1;
              } while (lVar81 != 0);
              unaff_BL = 0;
LAB_01696db7:
              unaff_BL = unaff_BL & 1;
              uVar80 = CONCAT71(local_7e0._1_7_,local_7e0[0] | unaff_BL);
              uVar83 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar111._4_4_ = uVar83;
              auVar111._0_4_ = uVar83;
              auVar111._8_4_ = uVar83;
              auVar111._12_4_ = uVar83;
              auVar111._16_4_ = uVar83;
              auVar111._20_4_ = uVar83;
              auVar111._24_4_ = uVar83;
              auVar111._28_4_ = uVar83;
              auVar17 = vcmpps_avx(_local_800,auVar111,2);
              auVar110 = vandps_avx(auVar17,local_6e0);
              auVar233 = ZEXT3264(auVar110);
              auVar17 = local_6e0 & auVar17;
              uVar84 = local_720;
              local_6e0 = auVar110;
            } while ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar17 >> 0x7f,0) != '\0') ||
                       (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar17 >> 0xbf,0) != '\0') ||
                     (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar17[0x1f] < '\0');
          }
          auVar116._0_4_ = auVar248._0_4_ * (float)local_880._0_4_;
          auVar116._4_4_ = auVar248._4_4_ * (float)local_880._4_4_;
          auVar116._8_4_ = auVar248._8_4_ * fStack_878;
          auVar116._12_4_ = auVar248._12_4_ * fStack_874;
          auVar116._16_4_ = auVar248._16_4_ * fStack_870;
          auVar116._20_4_ = auVar248._20_4_ * fStack_86c;
          auVar116._28_36_ = auVar233._28_36_;
          auVar116._24_4_ = auVar248._24_4_ * fStack_868;
          auVar96 = vfmadd213ps_fma(local_860,_local_a80,auVar116._0_32_);
          auVar96 = vfmadd213ps_fma(_local_840,auVar288,ZEXT1632(auVar96));
          auVar71._4_4_ = uStack_81c;
          auVar71._0_4_ = local_820;
          auVar71._8_4_ = uStack_818;
          auVar71._12_4_ = uStack_814;
          auVar71._16_4_ = uStack_810;
          auVar71._20_4_ = uStack_80c;
          auVar71._24_4_ = uStack_808;
          auVar71._28_4_ = uStack_804;
          auVar110 = vandps_avx(ZEXT1632(auVar96),auVar71);
          auVar145._8_4_ = 0x3e99999a;
          auVar145._0_8_ = 0x3e99999a3e99999a;
          auVar145._12_4_ = 0x3e99999a;
          auVar145._16_4_ = 0x3e99999a;
          auVar145._20_4_ = 0x3e99999a;
          auVar145._24_4_ = 0x3e99999a;
          auVar145._28_4_ = 0x3e99999a;
          auVar110 = vcmpps_avx(auVar110,auVar145,1);
          auVar17 = vorps_avx(auVar110,local_340);
          auVar146._0_4_ = (float)local_940._0_4_ + (float)local_6a0._0_4_;
          auVar146._4_4_ = (float)local_940._4_4_ + (float)local_6a0._4_4_;
          auVar146._8_4_ = fStack_938 + fStack_698;
          auVar146._12_4_ = fStack_934 + fStack_694;
          auVar146._16_4_ = fStack_930 + fStack_690;
          auVar146._20_4_ = fStack_92c + fStack_68c;
          auVar146._24_4_ = fStack_928 + fStack_688;
          auVar146._28_4_ = fStack_924 + fStack_684;
          uVar83 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar167._4_4_ = uVar83;
          auVar167._0_4_ = uVar83;
          auVar167._8_4_ = uVar83;
          auVar167._12_4_ = uVar83;
          auVar167._16_4_ = uVar83;
          auVar167._20_4_ = uVar83;
          auVar167._24_4_ = uVar83;
          auVar167._28_4_ = uVar83;
          auVar110 = vcmpps_avx(auVar146,auVar167,2);
          local_860 = vandps_avx(auVar110,local_6c0);
          auVar147._8_4_ = 3;
          auVar147._0_8_ = 0x300000003;
          auVar147._12_4_ = 3;
          auVar147._16_4_ = 3;
          auVar147._20_4_ = 3;
          auVar147._24_4_ = 3;
          auVar147._28_4_ = 3;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar110 = vblendvps_avx(auVar168,auVar147,auVar17);
          _local_880 = vpcmpgtd_avx2(auVar110,local_360);
          auVar110 = vpandn_avx2(_local_880,local_860);
          auVar17 = local_860 & ~_local_880;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar17 >> 0x7f,0) == '\0') &&
                (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar17 >> 0xbf,0) == '\0') &&
              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar17[0x1f]) {
            auVar233 = ZEXT3264(local_980);
            local_720 = uVar84;
          }
          else {
            auVar122 = vminps_avx(auVar9,auVar91);
            auVar96 = vmaxps_avx(auVar9,auVar91);
            auVar89 = vminps_avx(auVar10,auVar90);
            auVar123 = vminps_avx(auVar122,auVar89);
            auVar122 = vmaxps_avx(auVar10,auVar90);
            auVar89 = vmaxps_avx(auVar96,auVar122);
            auVar96 = vandps_avx(auVar123,local_9c0);
            auVar122 = vandps_avx(auVar89,local_9c0);
            auVar96 = vmaxps_avx(auVar96,auVar122);
            auVar122 = vmovshdup_avx(auVar96);
            auVar122 = vmaxss_avx(auVar122,auVar96);
            auVar96 = vshufpd_avx(auVar96,auVar96,1);
            auVar96 = vmaxss_avx(auVar96,auVar122);
            local_a20._0_4_ = auVar96._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar89,auVar89,0xff);
            _local_800 = _local_3a0;
            local_840._4_4_ = (float)local_940._4_4_ + (float)local_3a0._4_4_;
            local_840._0_4_ = (float)local_940._0_4_ + (float)local_3a0._0_4_;
            fStack_838 = fStack_938 + fStack_398;
            fStack_834 = fStack_934 + fStack_394;
            fStack_830 = fStack_930 + fStack_390;
            fStack_82c = fStack_92c + fStack_38c;
            fStack_828 = fStack_928 + fStack_388;
            fStack_824 = fStack_924 + fStack_384;
            do {
              auVar148._8_4_ = 0x7f800000;
              auVar148._0_8_ = 0x7f8000007f800000;
              auVar148._12_4_ = 0x7f800000;
              auVar148._16_4_ = 0x7f800000;
              auVar148._20_4_ = 0x7f800000;
              auVar148._24_4_ = 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar17 = vblendvps_avx(auVar148,_local_800,auVar110);
              auVar102 = vshufps_avx(auVar17,auVar17,0xb1);
              auVar102 = vminps_avx(auVar17,auVar102);
              auVar13 = vshufpd_avx(auVar102,auVar102,5);
              auVar102 = vminps_avx(auVar102,auVar13);
              auVar13 = vpermpd_avx2(auVar102,0x4e);
              auVar102 = vminps_avx(auVar102,auVar13);
              auVar102 = vcmpps_avx(auVar17,auVar102,0);
              auVar13 = auVar110 & auVar102;
              auVar17 = auVar110;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar17 = vandps_avx(auVar102,auVar110);
              }
              local_7e0._0_8_ = uVar80;
              uVar78 = vmovmskps_avx(auVar17);
              iVar77 = 0;
              for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar77 = iVar77 + 1;
              }
              uVar78 = iVar77 << 2;
              local_700 = auVar110;
              *(undefined4 *)(local_700 + uVar78) = 0;
              fVar120 = *(float *)(local_620 + uVar78);
              fVar292 = *(float *)(local_380 + uVar78);
              fVar151 = auVar8._0_4_;
              if ((float)local_9d0._0_4_ < 0.0) {
                fVar151 = sqrtf((float)local_9d0._0_4_);
              }
              local_920._0_4_ = fVar151 * 1.9073486e-06;
              lVar81 = 5;
              do {
                fVar151 = 1.0 - fVar120;
                auVar132._0_4_ = fVar119 * fVar120;
                auVar132._4_4_ = auVar91._4_4_ * fVar120;
                auVar132._8_4_ = auVar91._8_4_ * fVar120;
                auVar132._12_4_ = auVar91._12_4_ * fVar120;
                auVar159._4_4_ = fVar151;
                auVar159._0_4_ = fVar151;
                auVar159._8_4_ = fVar151;
                auVar159._12_4_ = fVar151;
                auVar96 = vfmadd231ps_fma(auVar132,auVar159,auVar9);
                auVar183._0_4_ = fVar198 * fVar120;
                auVar183._4_4_ = auVar10._4_4_ * fVar120;
                auVar183._8_4_ = auVar10._8_4_ * fVar120;
                auVar183._12_4_ = auVar10._12_4_ * fVar120;
                auVar122 = vfmadd231ps_fma(auVar183,auVar159,auVar91);
                auVar223._0_4_ = fVar120 * auVar122._0_4_;
                auVar223._4_4_ = fVar120 * auVar122._4_4_;
                auVar223._8_4_ = fVar120 * auVar122._8_4_;
                auVar223._12_4_ = fVar120 * auVar122._12_4_;
                auVar89 = vfmadd231ps_fma(auVar223,auVar159,auVar96);
                auVar133._0_4_ = fVar120 * fVar118;
                auVar133._4_4_ = fVar120 * fStack_b3c;
                auVar133._8_4_ = fVar120 * fStack_b38;
                auVar133._12_4_ = fVar120 * fStack_b34;
                auVar96 = vfmadd231ps_fma(auVar133,auVar159,auVar10);
                auVar204._0_4_ = fVar120 * auVar96._0_4_;
                auVar204._4_4_ = fVar120 * auVar96._4_4_;
                auVar204._8_4_ = fVar120 * auVar96._8_4_;
                auVar204._12_4_ = fVar120 * auVar96._12_4_;
                auVar122 = vfmadd231ps_fma(auVar204,auVar159,auVar122);
                auVar134._4_4_ = fVar292;
                auVar134._0_4_ = fVar292;
                auVar134._8_4_ = fVar292;
                auVar134._12_4_ = fVar292;
                auVar96 = vfmadd213ps_fma(auVar134,local_9b0,_DAT_01feba10);
                auVar95._0_4_ = fVar120 * auVar122._0_4_;
                auVar95._4_4_ = fVar120 * auVar122._4_4_;
                auVar95._8_4_ = fVar120 * auVar122._8_4_;
                auVar95._12_4_ = fVar120 * auVar122._12_4_;
                auVar123 = vfmadd231ps_fma(auVar95,auVar89,auVar159);
                local_740._0_16_ = auVar123;
                auVar96 = vsubps_avx(auVar96,auVar123);
                _local_900 = auVar96;
                auVar96 = vdpps_avx(auVar96,auVar96,0x7f);
                local_a00._0_16_ = auVar96;
                if (auVar96._0_4_ < 0.0) {
                  auVar262._0_4_ = sqrtf(auVar96._0_4_);
                  auVar262._4_60_ = extraout_var_00;
                  auVar96 = auVar262._0_16_;
                }
                else {
                  auVar96 = vsqrtss_avx(auVar96,auVar96);
                }
                auVar122 = vsubps_avx(auVar122,auVar89);
                auVar237._0_4_ = auVar122._0_4_ * 3.0;
                auVar237._4_4_ = auVar122._4_4_ * 3.0;
                auVar237._8_4_ = auVar122._8_4_ * 3.0;
                auVar237._12_4_ = auVar122._12_4_ * 3.0;
                auVar122 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar151),
                                           ZEXT416((uint)fVar120));
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar120),
                                          ZEXT416((uint)fVar151));
                fVar151 = fVar151 * 6.0;
                fVar86 = auVar122._0_4_ * 6.0;
                fVar156 = auVar89._0_4_ * 6.0;
                fVar152 = fVar120 * 6.0;
                auVar184._0_4_ = fVar152 * fVar118;
                auVar184._4_4_ = fVar152 * fStack_b3c;
                auVar184._8_4_ = fVar152 * fStack_b38;
                auVar184._12_4_ = fVar152 * fStack_b34;
                auVar135._4_4_ = fVar156;
                auVar135._0_4_ = fVar156;
                auVar135._8_4_ = fVar156;
                auVar135._12_4_ = fVar156;
                auVar122 = vfmadd132ps_fma(auVar135,auVar184,auVar10);
                auVar185._4_4_ = fVar86;
                auVar185._0_4_ = fVar86;
                auVar185._8_4_ = fVar86;
                auVar185._12_4_ = fVar86;
                auVar122 = vfmadd132ps_fma(auVar185,auVar122,auVar91);
                auVar89 = vdpps_avx(auVar237,auVar237,0x7f);
                auVar136._4_4_ = fVar151;
                auVar136._0_4_ = fVar151;
                auVar136._8_4_ = fVar151;
                auVar136._12_4_ = fVar151;
                auVar176 = vfmadd132ps_fma(auVar136,auVar122,auVar9);
                auVar122 = vblendps_avx(auVar89,_DAT_01feba10,0xe);
                auVar123 = vrsqrtss_avx(auVar122,auVar122);
                fVar156 = auVar89._0_4_;
                fVar151 = auVar123._0_4_;
                auVar123 = vdpps_avx(auVar237,auVar176,0x7f);
                fVar151 = fVar151 * 1.5 + fVar156 * -0.5 * fVar151 * fVar151 * fVar151;
                auVar137._0_4_ = auVar176._0_4_ * fVar156;
                auVar137._4_4_ = auVar176._4_4_ * fVar156;
                auVar137._8_4_ = auVar176._8_4_ * fVar156;
                auVar137._12_4_ = auVar176._12_4_ * fVar156;
                fVar86 = auVar123._0_4_;
                auVar224._0_4_ = auVar237._0_4_ * fVar86;
                auVar224._4_4_ = auVar237._4_4_ * fVar86;
                auVar224._8_4_ = auVar237._8_4_ * fVar86;
                auVar224._12_4_ = auVar237._12_4_ * fVar86;
                auVar123 = vsubps_avx(auVar137,auVar224);
                auVar122 = vrcpss_avx(auVar122,auVar122);
                auVar176 = vfnmadd213ss_fma(auVar122,auVar89,ZEXT416(0x40000000));
                fVar86 = auVar122._0_4_ * auVar176._0_4_;
                auVar122 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(fVar292 * (float)local_920._0_4_)));
                uVar80 = CONCAT44(auVar237._4_4_,auVar237._0_4_);
                auVar264._0_8_ = uVar80 ^ 0x8000000080000000;
                auVar264._8_4_ = -auVar237._8_4_;
                auVar264._12_4_ = -auVar237._12_4_;
                auVar186._0_4_ = fVar151 * auVar123._0_4_ * fVar86;
                auVar186._4_4_ = fVar151 * auVar123._4_4_ * fVar86;
                auVar186._8_4_ = fVar151 * auVar123._8_4_ * fVar86;
                auVar186._12_4_ = fVar151 * auVar123._12_4_ * fVar86;
                local_a60._0_4_ = auVar237._0_4_ * fVar151;
                local_a60._4_4_ = auVar237._4_4_ * fVar151;
                local_a60._8_4_ = auVar237._8_4_ * fVar151;
                local_a60._12_4_ = auVar237._12_4_ * fVar151;
                if (fVar156 < -fVar156) {
                  local_a40._0_16_ = auVar264;
                  local_960._0_16_ = auVar186;
                  fVar151 = sqrtf(fVar156);
                  auVar96 = ZEXT416(auVar96._0_4_);
                  auVar186 = local_960._0_16_;
                  auVar264 = local_a40._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar151 = auVar89._0_4_;
                }
                auVar266 = ZEXT1664(auVar264);
                auVar89 = vdpps_avx(_local_900,local_a60._0_16_,0x7f);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar96,
                                          ZEXT416((uint)auVar122._0_4_));
                auVar123 = vdpps_avx(auVar264,local_a60._0_16_,0x7f);
                auVar176 = vdpps_avx(_local_900,auVar186,0x7f);
                auVar138 = vdpps_avx(local_9b0,local_a60._0_16_,0x7f);
                auVar96 = vfmadd213ss_fma(ZEXT416((uint)(auVar96._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_a20._0_4_ / fVar151)),auVar88)
                ;
                local_a40._0_4_ = auVar96._0_4_;
                fVar151 = auVar123._0_4_ + auVar176._0_4_;
                auVar262 = ZEXT464((uint)fVar151);
                auVar97._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                auVar97._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                auVar97._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                auVar97._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                auVar96 = vdpps_avx(_local_900,auVar264,0x7f);
                auVar176 = vsubps_avx(local_a00._0_16_,auVar97);
                auVar123 = vrsqrtss_avx(auVar176,auVar176);
                fVar156 = auVar176._0_4_;
                fVar86 = auVar123._0_4_;
                fVar86 = fVar86 * 1.5 + fVar156 * -0.5 * fVar86 * fVar86 * fVar86;
                auVar123 = vdpps_avx(_local_900,local_9b0,0x7f);
                local_a60._0_16_ = vfnmadd231ss_fma(auVar96,auVar89,ZEXT416((uint)fVar151));
                auVar248 = ZEXT1664(local_a60._0_16_);
                auVar96 = vfnmadd231ss_fma(auVar123,auVar89,auVar138);
                if (fVar156 < 0.0) {
                  local_960._0_16_ = ZEXT416((uint)fVar151);
                  local_760._0_16_ = auVar138;
                  local_780._0_4_ = fVar86;
                  local_7a0._0_16_ = auVar96;
                  auVar248 = ZEXT1664(local_a60._0_16_);
                  auVar266 = ZEXT1664(auVar264);
                  fVar151 = sqrtf(fVar156);
                  auVar262 = ZEXT1664(local_960._0_16_);
                  fVar86 = (float)local_780._0_4_;
                  auVar96 = local_7a0._0_16_;
                  auVar138 = local_760._0_16_;
                }
                else {
                  auVar123 = vsqrtss_avx(auVar176,auVar176);
                  fVar151 = auVar123._0_4_;
                }
                auVar123 = vpermilps_avx(local_740._0_16_,0xff);
                auVar88 = vpermilps_avx(auVar237,0xff);
                auVar176 = vfmsub213ss_fma(local_a60._0_16_,ZEXT416((uint)fVar86),auVar88);
                auVar187._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = auVar138._8_4_ ^ 0x80000000;
                auVar187._12_4_ = auVar138._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar176._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar176._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar176._12_4_ ^ 0x80000000;
                auVar96 = ZEXT416((uint)(auVar96._0_4_ * fVar86));
                auVar121 = auVar262._0_16_;
                auVar176 = vfmsub231ss_fma(ZEXT416((uint)(auVar138._0_4_ * auVar176._0_4_)),auVar121
                                           ,auVar96);
                auVar96 = vinsertps_avx(auVar96,auVar187,0x10);
                uVar83 = auVar176._0_4_;
                auVar188._4_4_ = uVar83;
                auVar188._0_4_ = uVar83;
                auVar188._8_4_ = uVar83;
                auVar188._12_4_ = uVar83;
                auVar96 = vdivps_avx(auVar96,auVar188);
                auVar276 = ZEXT1664(auVar89);
                auVar138 = ZEXT416((uint)(fVar151 - auVar123._0_4_));
                auVar176 = vinsertps_avx(auVar89,auVar138,0x10);
                auVar160._0_4_ = auVar176._0_4_ * auVar96._0_4_;
                auVar160._4_4_ = auVar176._4_4_ * auVar96._4_4_;
                auVar160._8_4_ = auVar176._8_4_ * auVar96._8_4_;
                auVar160._12_4_ = auVar176._12_4_ * auVar96._12_4_;
                auVar96 = vinsertps_avx(auVar205,auVar121,0x1c);
                auVar96 = vdivps_avx(auVar96,auVar188);
                auVar123 = vhaddps_avx(auVar160,auVar160);
                auVar189._0_4_ = auVar176._0_4_ * auVar96._0_4_;
                auVar189._4_4_ = auVar176._4_4_ * auVar96._4_4_;
                auVar189._8_4_ = auVar176._8_4_ * auVar96._8_4_;
                auVar189._12_4_ = auVar176._12_4_ * auVar96._12_4_;
                auVar96 = vhaddps_avx(auVar189,auVar189);
                fVar120 = fVar120 - auVar123._0_4_;
                fVar292 = fVar292 - auVar96._0_4_;
                auVar96 = vandps_avx(auVar89,local_9c0);
                bVar53 = true;
                if ((float)local_a40._0_4_ <= auVar96._0_4_) {
                  auVar233 = ZEXT3264(local_980);
                }
                else {
                  auVar122 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a40._0_4_ + auVar122._0_4_)
                                                    ),local_7c0,ZEXT416(0x36000000));
                  auVar96 = vandps_avx(auVar138,local_9c0);
                  auVar233 = ZEXT3264(local_980);
                  if (auVar96._0_4_ < auVar122._0_4_) {
                    fVar292 = fVar292 + (float)local_8b0._0_4_;
                    if ((((fVar117 <= fVar292) &&
                         (fVar151 = *(float *)(ray + k * 4 + 0x100), fVar292 <= fVar151)) &&
                        (0.0 <= fVar120)) && (fVar120 <= 1.0)) {
                      auVar96 = vrsqrtss_avx(local_a00._0_16_,local_a00._0_16_);
                      fVar86 = auVar96._0_4_;
                      pGVar2 = (context->scene->geometries).items[uVar76].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          fVar86 = fVar86 * 1.5 + local_a00._0_4_ * -0.5 * fVar86 * fVar86 * fVar86;
                          auVar139._0_4_ = fVar86 * (float)local_900._0_4_;
                          auVar139._4_4_ = fVar86 * (float)local_900._4_4_;
                          auVar139._8_4_ = fVar86 * fStack_8f8;
                          auVar139._12_4_ = fVar86 * fStack_8f4;
                          auVar176 = vfmadd213ps_fma(auVar88,auVar139,auVar237);
                          auVar96 = vshufps_avx(auVar139,auVar139,0xc9);
                          auVar122 = vshufps_avx(auVar237,auVar237,0xc9);
                          auVar140._0_4_ = auVar139._0_4_ * auVar122._0_4_;
                          auVar140._4_4_ = auVar139._4_4_ * auVar122._4_4_;
                          auVar140._8_4_ = auVar139._8_4_ * auVar122._8_4_;
                          auVar140._12_4_ = auVar139._12_4_ * auVar122._12_4_;
                          auVar123 = vfmsub231ps_fma(auVar140,auVar237,auVar96);
                          auVar96 = vshufps_avx(auVar123,auVar123,0xc9);
                          auVar122 = vshufps_avx(auVar176,auVar176,0xc9);
                          auVar123 = vshufps_avx(auVar123,auVar123,0xd2);
                          auVar98._0_4_ = auVar176._0_4_ * auVar123._0_4_;
                          auVar98._4_4_ = auVar176._4_4_ * auVar123._4_4_;
                          auVar98._8_4_ = auVar176._8_4_ * auVar123._8_4_;
                          auVar98._12_4_ = auVar176._12_4_ * auVar123._12_4_;
                          auVar122 = vfmsub231ps_fma(auVar98,auVar96,auVar122);
                          auVar96 = vmovshdup_avx(auVar122);
                          auVar169._0_8_ = auVar96._0_8_;
                          auVar169._8_8_ = auVar169._0_8_;
                          auVar169._16_8_ = auVar169._0_8_;
                          auVar169._24_8_ = auVar169._0_8_;
                          auVar96 = vshufps_avx(auVar122,auVar122,0xaa);
                          local_4a0 = auVar96._0_8_;
                          local_480 = auVar122._0_4_;
                          local_4c0[0] = (RTCHitN)(char)auVar169._0_8_;
                          local_4c0[1] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                          local_4c0[2] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                          local_4c0[3] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                          local_4c0[4] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                          local_4c0[5] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                          local_4c0[6] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                          local_4c0[7] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                          local_4c0[8] = (RTCHitN)(char)auVar169._0_8_;
                          local_4c0[9] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                          local_4c0[10] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                          local_4c0[0xb] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                          local_4c0[0xc] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                          local_4c0[0xd] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                          local_4c0[0xe] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                          local_4c0[0xf] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                          local_4c0[0x10] = (RTCHitN)(char)auVar169._0_8_;
                          local_4c0[0x11] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                          local_4c0[0x12] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                          local_4c0[0x13] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                          local_4c0[0x14] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                          local_4c0[0x15] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                          local_4c0[0x16] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                          local_4c0[0x17] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                          local_4c0[0x18] = (RTCHitN)(char)auVar169._0_8_;
                          local_4c0[0x19] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 8);
                          local_4c0[0x1a] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x10);
                          local_4c0[0x1b] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x18);
                          local_4c0[0x1c] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x20);
                          local_4c0[0x1d] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x28);
                          local_4c0[0x1e] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x30);
                          local_4c0[0x1f] = (RTCHitN)(char)((ulong)auVar169._0_8_ >> 0x38);
                          uStack_498 = local_4a0;
                          uStack_490 = local_4a0;
                          uStack_488 = local_4a0;
                          uStack_47c = local_480;
                          uStack_478 = local_480;
                          uStack_474 = local_480;
                          uStack_470 = local_480;
                          uStack_46c = local_480;
                          uStack_468 = local_480;
                          uStack_464 = local_480;
                          local_460 = fVar120;
                          fStack_45c = fVar120;
                          fStack_458 = fVar120;
                          fStack_454 = fVar120;
                          fStack_450 = fVar120;
                          fStack_44c = fVar120;
                          fStack_448 = fVar120;
                          fStack_444 = fVar120;
                          local_440 = ZEXT432(0) << 0x20;
                          local_420 = CONCAT44(uStack_59c,local_5a0);
                          uStack_418 = CONCAT44(uStack_594,uStack_598);
                          uStack_410 = CONCAT44(uStack_58c,uStack_590);
                          uStack_408 = CONCAT44(uStack_584,uStack_588);
                          local_400 = CONCAT44(uStack_57c,local_580);
                          uStack_3f8 = CONCAT44(uStack_574,uStack_578);
                          uStack_3f0 = CONCAT44(uStack_56c,uStack_570);
                          uStack_3e8 = CONCAT44(uStack_564,uStack_568);
                          auVar110 = vpcmpeqd_avx2(auVar169,auVar169);
                          local_3e0 = context->user->instID[0];
                          uStack_3dc = local_3e0;
                          uStack_3d8 = local_3e0;
                          uStack_3d4 = local_3e0;
                          uStack_3d0 = local_3e0;
                          uStack_3cc = local_3e0;
                          uStack_3c8 = local_3e0;
                          uStack_3c4 = local_3e0;
                          local_3c0 = context->user->instPrimID[0];
                          uStack_3bc = local_3c0;
                          uStack_3b8 = local_3c0;
                          uStack_3b4 = local_3c0;
                          uStack_3b0 = local_3c0;
                          uStack_3ac = local_3c0;
                          uStack_3a8 = local_3c0;
                          uStack_3a4 = local_3c0;
                          *(float *)(ray + k * 4 + 0x100) = fVar292;
                          local_8e0 = local_5c0._0_8_;
                          uStack_8d8 = local_5c0._8_8_;
                          uStack_8d0 = local_5c0._16_8_;
                          uStack_8c8 = local_5c0._24_8_;
                          local_ad0.valid = (int *)&local_8e0;
                          local_ad0.geometryUserPtr = pGVar2->userPtr;
                          local_ad0.context = context->user;
                          local_ad0.hit = local_4c0;
                          local_ad0.N = 8;
                          local_ad0.ray = (RTCRayN *)ray;
                          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar110 = ZEXT1632(auVar110._0_16_);
                            auVar248 = ZEXT1664(auVar248._0_16_);
                            auVar262 = ZEXT1664(auVar121);
                            auVar266 = ZEXT1664(auVar266._0_16_);
                            auVar276 = ZEXT1664(auVar89);
                            (*pGVar2->occlusionFilterN)(&local_ad0);
                            auVar233 = ZEXT3264(local_980);
                            auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                          }
                          auVar65._8_8_ = uStack_8d8;
                          auVar65._0_8_ = local_8e0;
                          auVar65._16_8_ = uStack_8d0;
                          auVar65._24_8_ = uStack_8c8;
                          auVar102 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar65);
                          auVar17 = auVar110 & ~auVar102;
                          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar17 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && SUB321(auVar17 >> 0x7f,0) == '\0') &&
                                (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar17 >> 0xbf,0) == '\0') &&
                              (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                              -1 < auVar17[0x1f]) {
                            auVar102 = auVar102 ^ auVar110;
                          }
                          else {
                            p_Var3 = context->args->filter;
                            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar110 = ZEXT1632(auVar110._0_16_);
                              auVar248 = ZEXT1664(auVar248._0_16_);
                              auVar262 = ZEXT1664(auVar262._0_16_);
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              auVar276 = ZEXT1664(auVar276._0_16_);
                              (*p_Var3)(&local_ad0);
                              auVar233 = ZEXT3264(local_980);
                              auVar110 = vpcmpeqd_avx2(auVar110,auVar110);
                            }
                            auVar66._8_8_ = uStack_8d8;
                            auVar66._0_8_ = local_8e0;
                            auVar66._16_8_ = uStack_8d0;
                            auVar66._24_8_ = uStack_8c8;
                            auVar17 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                    auVar66);
                            auVar102 = auVar17 ^ auVar110;
                            auVar170._8_4_ = 0xff800000;
                            auVar170._0_8_ = 0xff800000ff800000;
                            auVar170._12_4_ = 0xff800000;
                            auVar170._16_4_ = 0xff800000;
                            auVar170._20_4_ = 0xff800000;
                            auVar170._24_4_ = 0xff800000;
                            auVar170._28_4_ = 0xff800000;
                            auVar110 = vblendvps_avx(auVar170,*(undefined1 (*) [32])
                                                               (local_ad0.ray + 0x100),auVar17);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar110;
                          }
                          bVar61 = (auVar102 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar62 = (auVar102 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar60 = (auVar102 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar59 = SUB321(auVar102 >> 0x7f,0) != '\0';
                          bVar58 = (auVar102 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar57 = SUB321(auVar102 >> 0xbf,0) != '\0';
                          bVar55 = (auVar102 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar53 = auVar102[0x1f] < '\0';
                          unaff_BL = ((((((bVar61 || bVar62) || bVar60) || bVar59) || bVar58) ||
                                      bVar57) || bVar55) || bVar53;
                          if (((((((!bVar61 && !bVar62) && !bVar60) && !bVar59) && !bVar58) &&
                               !bVar57) && !bVar55) && !bVar53) {
                            *(float *)(ray + k * 4 + 0x100) = fVar151;
                          }
                        }
                        bVar53 = false;
                        goto LAB_0169750c;
                      }
                    }
                    bVar53 = false;
                    unaff_BL = 0;
                  }
                }
LAB_0169750c:
                if (!bVar53) goto LAB_0169783c;
                lVar81 = lVar81 + -1;
              } while (lVar81 != 0);
              unaff_BL = 0;
LAB_0169783c:
              unaff_BL = unaff_BL & 1;
              uVar80 = CONCAT71(local_7e0._1_7_,local_7e0[0] | unaff_BL);
              uVar83 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar112._4_4_ = uVar83;
              auVar112._0_4_ = uVar83;
              auVar112._8_4_ = uVar83;
              auVar112._12_4_ = uVar83;
              auVar112._16_4_ = uVar83;
              auVar112._20_4_ = uVar83;
              auVar112._24_4_ = uVar83;
              auVar112._28_4_ = uVar83;
              auVar17 = vcmpps_avx(_local_840,auVar112,2);
              auVar110 = vandps_avx(auVar17,local_700);
              local_700 = local_700 & auVar17;
            } while ((((((((local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_700 >> 0x7f,0) != '\0') ||
                       (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_700 >> 0xbf,0) != '\0') ||
                     (local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_700[0x1f] < '\0');
          }
          auVar149._0_4_ = (float)local_940._0_4_ + local_500._0_4_;
          auVar149._4_4_ = (float)local_940._4_4_ + local_500._4_4_;
          auVar149._8_4_ = fStack_938 + local_500._8_4_;
          auVar149._12_4_ = fStack_934 + local_500._12_4_;
          auVar149._16_4_ = fStack_930 + local_500._16_4_;
          auVar149._20_4_ = fStack_92c + local_500._20_4_;
          auVar149._24_4_ = fStack_928 + local_500._24_4_;
          auVar149._28_4_ = fStack_924 + local_500._28_4_;
          uVar83 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar196._4_4_ = uVar83;
          auVar196._0_4_ = uVar83;
          auVar196._8_4_ = uVar83;
          auVar196._12_4_ = uVar83;
          auVar196._16_4_ = uVar83;
          auVar196._20_4_ = uVar83;
          auVar196._24_4_ = uVar83;
          auVar196._28_4_ = uVar83;
          auVar17 = vcmpps_avx(auVar149,auVar196,2);
          auVar110 = vandps_avx(local_680,local_660);
          auVar110 = vandps_avx(auVar17,auVar110);
          auVar209._0_4_ = (float)local_940._0_4_ + local_3a0._0_4_;
          auVar209._4_4_ = (float)local_940._4_4_ + local_3a0._4_4_;
          auVar209._8_4_ = fStack_938 + local_3a0._8_4_;
          auVar209._12_4_ = fStack_934 + local_3a0._12_4_;
          auVar209._16_4_ = fStack_930 + local_3a0._16_4_;
          auVar209._20_4_ = fStack_92c + local_3a0._20_4_;
          auVar209._24_4_ = fStack_928 + local_3a0._24_4_;
          auVar209._28_4_ = fStack_924 + local_3a0._28_4_;
          auVar102 = vcmpps_avx(auVar209,auVar196,2);
          auVar17 = vandps_avx(_local_880,local_860);
          auVar17 = vandps_avx(auVar102,auVar17);
          auVar17 = vorps_avx(auVar110,auVar17);
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar17;
            auVar110 = vblendvps_avx(_local_3a0,local_500,auVar110);
            *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar110;
            uVar87 = vmovlps_avx(local_8a0);
            *(undefined8 *)(afStack_140 + uVar79 * 0x18) = uVar87;
            auStack_138[uVar79 * 0x18] = (int)local_720 + 1;
            uVar79 = (ulong)((int)uVar79 + 1);
          }
        }
      }
    }
    do {
      uVar78 = (uint)uVar79;
      if (uVar78 == 0) {
        if ((uVar80 & 1) != 0) {
          return local_c69;
        }
        uVar83 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar99._4_4_ = uVar83;
        auVar99._0_4_ = uVar83;
        auVar99._8_4_ = uVar83;
        auVar99._12_4_ = uVar83;
        auVar5 = vcmpps_avx(local_5d0,auVar99,2);
        uVar76 = vmovmskps_avx(auVar5);
        uVar76 = uVar76 & (uint)local_888 - 1 & (uint)local_888;
        local_c69 = uVar76 != 0;
        if (!local_c69) {
          return local_c69;
        }
        goto LAB_0169544d;
      }
      uVar79 = (ulong)(uVar78 - 1);
      lVar81 = uVar79 * 0x60;
      auVar110 = *(undefined1 (*) [32])(auStack_160 + lVar81);
      auVar113._0_4_ = (float)local_940._0_4_ + auVar110._0_4_;
      auVar113._4_4_ = (float)local_940._4_4_ + auVar110._4_4_;
      auVar113._8_4_ = fStack_938 + auVar110._8_4_;
      auVar113._12_4_ = fStack_934 + auVar110._12_4_;
      auVar113._16_4_ = fStack_930 + auVar110._16_4_;
      auVar113._20_4_ = fStack_92c + auVar110._20_4_;
      auVar113._24_4_ = fStack_928 + auVar110._24_4_;
      auVar113._28_4_ = fStack_924 + auVar110._28_4_;
      uVar83 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar197._4_4_ = uVar83;
      auVar197._0_4_ = uVar83;
      auVar197._8_4_ = uVar83;
      auVar197._12_4_ = uVar83;
      auVar197._16_4_ = uVar83;
      auVar197._20_4_ = uVar83;
      auVar197._24_4_ = uVar83;
      auVar197._28_4_ = uVar83;
      auVar102 = vcmpps_avx(auVar113,auVar197,2);
      auVar17 = vandps_avx(auVar102,*(undefined1 (*) [32])(auStack_180 + lVar81));
      local_4c0[0] = (RTCHitN)auVar17[0];
      local_4c0[1] = (RTCHitN)auVar17[1];
      local_4c0[2] = (RTCHitN)auVar17[2];
      local_4c0[3] = (RTCHitN)auVar17[3];
      local_4c0[4] = (RTCHitN)auVar17[4];
      local_4c0[5] = (RTCHitN)auVar17[5];
      local_4c0[6] = (RTCHitN)auVar17[6];
      local_4c0[7] = (RTCHitN)auVar17[7];
      local_4c0[8] = (RTCHitN)auVar17[8];
      local_4c0[9] = (RTCHitN)auVar17[9];
      local_4c0[10] = (RTCHitN)auVar17[10];
      local_4c0[0xb] = (RTCHitN)auVar17[0xb];
      local_4c0[0xc] = (RTCHitN)auVar17[0xc];
      local_4c0[0xd] = (RTCHitN)auVar17[0xd];
      local_4c0[0xe] = (RTCHitN)auVar17[0xe];
      local_4c0[0xf] = (RTCHitN)auVar17[0xf];
      local_4c0[0x10] = (RTCHitN)auVar17[0x10];
      local_4c0[0x11] = (RTCHitN)auVar17[0x11];
      local_4c0[0x12] = (RTCHitN)auVar17[0x12];
      local_4c0[0x13] = (RTCHitN)auVar17[0x13];
      local_4c0[0x14] = (RTCHitN)auVar17[0x14];
      local_4c0[0x15] = (RTCHitN)auVar17[0x15];
      local_4c0[0x16] = (RTCHitN)auVar17[0x16];
      local_4c0[0x17] = (RTCHitN)auVar17[0x17];
      local_4c0[0x18] = (RTCHitN)auVar17[0x18];
      local_4c0[0x19] = (RTCHitN)auVar17[0x19];
      local_4c0[0x1a] = (RTCHitN)auVar17[0x1a];
      local_4c0[0x1b] = (RTCHitN)auVar17[0x1b];
      local_4c0[0x1c] = (RTCHitN)auVar17[0x1c];
      local_4c0[0x1d] = (RTCHitN)auVar17[0x1d];
      local_4c0[0x1e] = (RTCHitN)auVar17[0x1e];
      local_4c0[0x1f] = (RTCHitN)auVar17[0x1f];
      auVar102 = *(undefined1 (*) [32])(auStack_180 + lVar81) & auVar102;
      bVar61 = (auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar60 = (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar59 = SUB321(auVar102 >> 0x7f,0) == '\0';
      bVar58 = (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar57 = SUB321(auVar102 >> 0xbf,0) == '\0';
      bVar55 = (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar53 = -1 < auVar102[0x1f];
      if (((((((!bVar61 || !bVar62) || !bVar60) || !bVar59) || !bVar58) || !bVar57) || !bVar55) ||
          !bVar53) {
        auVar171._8_4_ = 0x7f800000;
        auVar171._0_8_ = 0x7f8000007f800000;
        auVar171._12_4_ = 0x7f800000;
        auVar171._16_4_ = 0x7f800000;
        auVar171._20_4_ = 0x7f800000;
        auVar171._24_4_ = 0x7f800000;
        auVar171._28_4_ = 0x7f800000;
        auVar110 = vblendvps_avx(auVar171,auVar110,auVar17);
        auVar102 = vshufps_avx(auVar110,auVar110,0xb1);
        auVar102 = vminps_avx(auVar110,auVar102);
        auVar13 = vshufpd_avx(auVar102,auVar102,5);
        auVar102 = vminps_avx(auVar102,auVar13);
        auVar13 = vpermpd_avx2(auVar102,0x4e);
        auVar102 = vminps_avx(auVar102,auVar13);
        auVar110 = vcmpps_avx(auVar110,auVar102,0);
        auVar102 = auVar17 & auVar110;
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0x7f,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0xbf,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar102[0x1f] < '\0') {
          auVar17 = vandps_avx(auVar110,auVar17);
        }
        fVar120 = afStack_140[uVar79 * 0x18 + 1];
        local_720 = (ulong)auStack_138[uVar79 * 0x18];
        uVar82 = vmovmskps_avx(auVar17);
        iVar77 = 0;
        for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
          iVar77 = iVar77 + 1;
        }
        fVar292 = afStack_140[uVar79 * 0x18];
        auVar114._4_4_ = fVar292;
        auVar114._0_4_ = fVar292;
        auVar114._8_4_ = fVar292;
        auVar114._12_4_ = fVar292;
        auVar114._16_4_ = fVar292;
        auVar114._20_4_ = fVar292;
        auVar114._24_4_ = fVar292;
        auVar114._28_4_ = fVar292;
        *(undefined4 *)(local_4c0 + (uint)(iVar77 << 2)) = 0;
        *(RTCHitN (*) [32])(auStack_180 + lVar81) = local_4c0;
        uVar82 = uVar78 - 1;
        if (((((((((undefined1  [32])local_4c0 >> 0x1f & (undefined1  [32])0x1) !=
                  (undefined1  [32])0x0 ||
                 ((undefined1  [32])local_4c0 >> 0x3f & (undefined1  [32])0x1) !=
                 (undefined1  [32])0x0) ||
                ((undefined1  [32])local_4c0 >> 0x5f & (undefined1  [32])0x1) !=
                (undefined1  [32])0x0) || SUB321((undefined1  [32])local_4c0 >> 0x7f,0) != '\0') ||
              ((undefined1  [32])local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
              ) || SUB321((undefined1  [32])local_4c0 >> 0xbf,0) != '\0') ||
            ((undefined1  [32])local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
            || local_4c0[0x1f] < '\0') {
          uVar82 = uVar78;
        }
        fVar120 = fVar120 - fVar292;
        auVar150._4_4_ = fVar120;
        auVar150._0_4_ = fVar120;
        auVar150._8_4_ = fVar120;
        auVar150._12_4_ = fVar120;
        auVar150._16_4_ = fVar120;
        auVar150._20_4_ = fVar120;
        auVar150._24_4_ = fVar120;
        auVar150._28_4_ = fVar120;
        auVar96 = vfmadd132ps_fma(auVar150,auVar114,_DAT_02020f20);
        local_500 = ZEXT1632(auVar96);
        local_8a0._8_8_ = 0;
        local_8a0._0_8_ = *(ulong *)(local_500 + (uint)(iVar77 << 2));
        uVar79 = (ulong)uVar82;
      }
    } while (((((((bVar61 && bVar62) && bVar60) && bVar59) && bVar58) && bVar57) && bVar55) &&
             bVar53);
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }